

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int iVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  uint uVar85;
  undefined1 (*pauVar86) [32];
  uint uVar87;
  uint uVar88;
  int iVar89;
  ulong uVar90;
  ulong uVar91;
  bool bVar92;
  bool bVar93;
  byte bVar94;
  float fVar95;
  float fVar125;
  float fVar127;
  vint4 bi_2;
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined4 uVar96;
  float fVar97;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar113 [32];
  float fVar126;
  float fVar128;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar111 [16];
  undefined1 auVar124 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar146 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar136 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  float fVar151;
  float fVar179;
  float fVar180;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar181;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar160 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar168 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  vint4 ai_2;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar191 [16];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar214;
  float fVar217;
  vint4 ai;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar220;
  undefined1 auVar210 [32];
  float fVar215;
  float fVar218;
  float fVar221;
  undefined1 auVar211 [32];
  float fVar216;
  float fVar219;
  float fVar222;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  vint4 bi;
  undefined1 auVar241 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [28];
  undefined1 auVar235 [32];
  undefined1 auVar242 [32];
  undefined1 auVar239 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar243 [32];
  undefined1 auVar240 [16];
  undefined1 auVar244 [64];
  vint4 ai_1;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar259;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar260;
  float fVar265;
  float fVar266;
  undefined1 auVar261 [16];
  float fVar267;
  undefined1 auVar263 [32];
  undefined1 auVar262 [16];
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar264 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar276;
  float fVar277;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c08;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  uint local_780;
  uint uStack_77c;
  uint uStack_778;
  uint uStack_774;
  uint local_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined4 uStack_738;
  undefined4 uStack_734;
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint uStack_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint uStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar236 [16];
  undefined1 auVar275 [64];
  undefined1 auVar281 [64];
  undefined1 auVar286 [64];
  
  PVar2 = prim[1];
  uVar91 = (ulong)(byte)PVar2;
  fVar95 = *(float *)(prim + uVar91 * 0x19 + 0x12);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar91 * 0x19 + 6));
  auVar98._0_4_ = fVar95 * auVar5._0_4_;
  auVar98._4_4_ = fVar95 * auVar5._4_4_;
  auVar98._8_4_ = fVar95 * auVar5._8_4_;
  auVar98._12_4_ = fVar95 * auVar5._12_4_;
  auVar223._0_4_ = fVar95 * auVar6._0_4_;
  auVar223._4_4_ = fVar95 * auVar6._4_4_;
  auVar223._8_4_ = fVar95 * auVar6._8_4_;
  auVar223._12_4_ = fVar95 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar91 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar90 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar91 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar90 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar291._4_4_ = auVar223._0_4_;
  auVar291._0_4_ = auVar223._0_4_;
  auVar291._8_4_ = auVar223._0_4_;
  auVar291._12_4_ = auVar223._0_4_;
  auVar107 = vshufps_avx(auVar223,auVar223,0x55);
  auVar102 = vshufps_avx(auVar223,auVar223,0xaa);
  fVar95 = auVar102._0_4_;
  auVar278._0_4_ = fVar95 * auVar8._0_4_;
  fVar125 = auVar102._4_4_;
  auVar278._4_4_ = fVar125 * auVar8._4_4_;
  fVar200 = auVar102._8_4_;
  auVar278._8_4_ = fVar200 * auVar8._8_4_;
  fVar214 = auVar102._12_4_;
  auVar278._12_4_ = fVar214 * auVar8._12_4_;
  auVar271._0_4_ = auVar11._0_4_ * fVar95;
  auVar271._4_4_ = auVar11._4_4_ * fVar125;
  auVar271._8_4_ = auVar11._8_4_ * fVar200;
  auVar271._12_4_ = auVar11._12_4_ * fVar214;
  auVar245._0_4_ = auVar152._0_4_ * fVar95;
  auVar245._4_4_ = auVar152._4_4_ * fVar125;
  auVar245._8_4_ = auVar152._8_4_ * fVar200;
  auVar245._12_4_ = auVar152._12_4_ * fVar214;
  auVar102 = vfmadd231ps_fma(auVar278,auVar107,auVar6);
  auVar133 = vfmadd231ps_fma(auVar271,auVar107,auVar10);
  auVar107 = vfmadd231ps_fma(auVar245,auVar99,auVar107);
  auVar164 = vfmadd231ps_fma(auVar102,auVar291,auVar5);
  auVar133 = vfmadd231ps_fma(auVar133,auVar291,auVar9);
  auVar201 = vfmadd231ps_fma(auVar107,auVar100,auVar291);
  auVar292._4_4_ = auVar98._0_4_;
  auVar292._0_4_ = auVar98._0_4_;
  auVar292._8_4_ = auVar98._0_4_;
  auVar292._12_4_ = auVar98._0_4_;
  auVar107 = vshufps_avx(auVar98,auVar98,0x55);
  auVar102 = vshufps_avx(auVar98,auVar98,0xaa);
  fVar95 = auVar102._0_4_;
  auVar224._0_4_ = fVar95 * auVar8._0_4_;
  fVar125 = auVar102._4_4_;
  auVar224._4_4_ = fVar125 * auVar8._4_4_;
  fVar200 = auVar102._8_4_;
  auVar224._8_4_ = fVar200 * auVar8._8_4_;
  fVar214 = auVar102._12_4_;
  auVar224._12_4_ = fVar214 * auVar8._12_4_;
  auVar132._0_4_ = auVar11._0_4_ * fVar95;
  auVar132._4_4_ = auVar11._4_4_ * fVar125;
  auVar132._8_4_ = auVar11._8_4_ * fVar200;
  auVar132._12_4_ = auVar11._12_4_ * fVar214;
  auVar102._0_4_ = auVar152._0_4_ * fVar95;
  auVar102._4_4_ = auVar152._4_4_ * fVar125;
  auVar102._8_4_ = auVar152._8_4_ * fVar200;
  auVar102._12_4_ = auVar152._12_4_ * fVar214;
  auVar6 = vfmadd231ps_fma(auVar224,auVar107,auVar6);
  auVar8 = vfmadd231ps_fma(auVar132,auVar107,auVar10);
  auVar10 = vfmadd231ps_fma(auVar102,auVar107,auVar99);
  auVar11 = vfmadd231ps_fma(auVar6,auVar292,auVar5);
  auVar99 = vfmadd231ps_fma(auVar8,auVar292,auVar9);
  auVar152 = vfmadd231ps_fma(auVar10,auVar292,auVar100);
  auVar237._8_4_ = 0x7fffffff;
  auVar237._0_8_ = 0x7fffffff7fffffff;
  auVar237._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar164,auVar237);
  auVar156._8_4_ = 0x219392ef;
  auVar156._0_8_ = 0x219392ef219392ef;
  auVar156._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar156,1);
  auVar6 = vblendvps_avx(auVar164,auVar156,auVar5);
  auVar5 = vandps_avx(auVar133,auVar237);
  auVar5 = vcmpps_avx(auVar5,auVar156,1);
  auVar8 = vblendvps_avx(auVar133,auVar156,auVar5);
  auVar5 = vandps_avx(auVar201,auVar237);
  auVar5 = vcmpps_avx(auVar5,auVar156,1);
  auVar5 = vblendvps_avx(auVar201,auVar156,auVar5);
  auVar9 = vrcpps_avx(auVar6);
  auVar238._8_4_ = 0x3f800000;
  auVar238._0_8_ = 0x3f8000003f800000;
  auVar238._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar9,auVar238);
  auVar9 = vfmadd132ps_fma(auVar6,auVar9,auVar9);
  auVar6 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar6,auVar238);
  auVar10 = vfmadd132ps_fma(auVar8,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar238);
  auVar100 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar11);
  auVar201._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar201._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar201._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar201._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar11);
  auVar225._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar225._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar225._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar225._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar133._1_3_ = 0;
  auVar133[0] = PVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar91 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar99);
  auVar246._0_4_ = auVar5._0_4_ * auVar10._0_4_;
  auVar246._4_4_ = auVar5._4_4_ * auVar10._4_4_;
  auVar246._8_4_ = auVar5._8_4_ * auVar10._8_4_;
  auVar246._12_4_ = auVar5._12_4_ * auVar10._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar99);
  auVar107._0_4_ = auVar10._0_4_ * auVar5._0_4_;
  auVar107._4_4_ = auVar10._4_4_ * auVar5._4_4_;
  auVar107._8_4_ = auVar10._8_4_ * auVar5._8_4_;
  auVar107._12_4_ = auVar10._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar90 + uVar91 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar152);
  auVar164._0_4_ = auVar100._0_4_ * auVar5._0_4_;
  auVar164._4_4_ = auVar100._4_4_ * auVar5._4_4_;
  auVar164._8_4_ = auVar100._8_4_ * auVar5._8_4_;
  auVar164._12_4_ = auVar100._12_4_ * auVar5._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar91 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar11);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar152);
  auVar99._0_4_ = auVar100._0_4_ * auVar5._0_4_;
  auVar99._4_4_ = auVar100._4_4_ * auVar5._4_4_;
  auVar99._8_4_ = auVar100._8_4_ * auVar5._8_4_;
  auVar99._12_4_ = auVar100._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar201,auVar225);
  auVar6 = vpminsd_avx(auVar246,auVar107);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar164,auVar99);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar261._4_4_ = uVar96;
  auVar261._0_4_ = uVar96;
  auVar261._8_4_ = uVar96;
  auVar261._12_4_ = uVar96;
  auVar6 = vmaxps_avx(auVar6,auVar261);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_5a0._0_4_ = auVar5._0_4_ * 0.99999964;
  local_5a0._4_4_ = auVar5._4_4_ * 0.99999964;
  local_5a0._8_4_ = auVar5._8_4_ * 0.99999964;
  local_5a0._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar201,auVar225);
  auVar6 = vpmaxsd_avx(auVar246,auVar107);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar164,auVar99);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar152._4_4_ = uVar96;
  auVar152._0_4_ = uVar96;
  auVar152._8_4_ = uVar96;
  auVar152._12_4_ = uVar96;
  auVar6 = vminps_avx(auVar6,auVar152);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar100._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar100._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar100._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar100._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar133[4] = PVar2;
  auVar133._5_3_ = 0;
  auVar133[8] = PVar2;
  auVar133._9_3_ = 0;
  auVar133[0xc] = PVar2;
  auVar133._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar133,_DAT_01f7fcf0);
  auVar5 = vcmpps_avx(local_5a0,auVar100,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar85 = vmovmskps_avx(auVar5);
  if (uVar85 == 0) {
    return false;
  }
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  uVar85 = uVar85 & 0xff;
  local_2e0 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
  local_860 = 0x7fffffff;
  uStack_85c = 0x7fffffff;
  uStack_858 = 0x7fffffff;
  uStack_854 = 0x7fffffff;
  uStack_850 = 0x7fffffff;
  uStack_84c = 0x7fffffff;
  uStack_848 = 0x7fffffff;
  uStack_844 = 0x7fffffff;
  local_680 = 0x80000000;
  uStack_67c = 0x80000000;
  uStack_678 = 0x80000000;
  uStack_674 = 0x80000000;
  fStack_670 = -0.0;
  fStack_66c = -0.0;
  fStack_668 = -0.0;
  uStack_664 = 0x80000000;
  local_8b0 = prim;
LAB_0165301a:
  lVar25 = 0;
  local_8a8 = (ulong)uVar85;
  for (uVar90 = local_8a8; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar85 = *(uint *)(local_8b0 + 2);
  local_780 = *(uint *)(local_8b0 + lVar25 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar85].ptr;
  uVar90 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_780);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar25 = *(long *)&pGVar3[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar25 + (long)p_Var4 * uVar90);
  auVar6 = *(undefined1 (*) [16])(lVar25 + (uVar90 + 1) * (long)p_Var4);
  auVar8 = *(undefined1 (*) [16])(lVar25 + (uVar90 + 2) * (long)p_Var4);
  local_8a8 = local_8a8 - 1 & local_8a8;
  auVar9 = *(undefined1 (*) [16])(lVar25 + (uVar90 + 3) * (long)p_Var4);
  if (local_8a8 != 0) {
    uVar91 = local_8a8 - 1 & local_8a8;
    for (uVar90 = local_8a8; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
    }
    if (uVar91 != 0) {
      for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar11 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar272._4_4_ = uVar96;
  auVar272._0_4_ = uVar96;
  auVar272._8_4_ = uVar96;
  auVar272._12_4_ = uVar96;
  fStack_810 = (float)uVar96;
  _local_820 = auVar272;
  fStack_80c = (float)uVar96;
  fStack_808 = (float)uVar96;
  register0x0000149c = uVar96;
  auVar275 = ZEXT3264(_local_820);
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar279._4_4_ = uVar96;
  auVar279._0_4_ = uVar96;
  auVar279._8_4_ = uVar96;
  auVar279._12_4_ = uVar96;
  fStack_a50 = (float)uVar96;
  _local_a60 = auVar279;
  fStack_a4c = (float)uVar96;
  fStack_a48 = (float)uVar96;
  register0x000014dc = uVar96;
  auVar281 = ZEXT3264(_local_a60);
  auVar10 = vunpcklps_avx(auVar272,auVar279);
  fVar95 = *(float *)(ray + k * 4 + 0x60);
  auVar282._4_4_ = fVar95;
  auVar282._0_4_ = fVar95;
  auVar282._8_4_ = fVar95;
  auVar282._12_4_ = fVar95;
  fStack_970 = fVar95;
  _local_980 = auVar282;
  fStack_96c = fVar95;
  fStack_968 = fVar95;
  register0x0000151c = fVar95;
  auVar286 = ZEXT3264(_local_980);
  local_9b0 = vinsertps_avx(auVar10,auVar282,0x28);
  auVar226._0_4_ = (auVar5._0_4_ + auVar6._0_4_ + auVar8._0_4_ + auVar9._0_4_) * 0.25;
  auVar226._4_4_ = (auVar5._4_4_ + auVar6._4_4_ + auVar8._4_4_ + auVar9._4_4_) * 0.25;
  auVar226._8_4_ = (auVar5._8_4_ + auVar6._8_4_ + auVar8._8_4_ + auVar9._8_4_) * 0.25;
  auVar226._12_4_ = (auVar5._12_4_ + auVar6._12_4_ + auVar8._12_4_ + auVar9._12_4_) * 0.25;
  auVar10 = vsubps_avx(auVar226,auVar11);
  auVar10 = vdpps_avx(auVar10,local_9b0,0x7f);
  local_9c0 = vdpps_avx(local_9b0,local_9b0,0x7f);
  auVar264 = ZEXT1664(local_9c0);
  auVar100 = vrcpss_avx(local_9c0,local_9c0);
  auVar99 = vfnmadd213ss_fma(auVar100,local_9c0,ZEXT416(0x40000000));
  local_300 = auVar10._0_4_ * auVar100._0_4_ * auVar99._0_4_;
  auVar233._4_4_ = local_300;
  auVar233._0_4_ = local_300;
  auVar233._8_4_ = local_300;
  auVar233._12_4_ = local_300;
  fStack_910 = local_300;
  _local_920 = auVar233;
  fStack_90c = local_300;
  fStack_908 = local_300;
  fStack_904 = local_300;
  auVar10 = vfmadd231ps_fma(auVar11,local_9b0,auVar233);
  auVar10 = vblendps_avx(auVar10,_DAT_01f7aa10,8);
  auVar11 = vsubps_avx(auVar5,auVar10);
  auVar8 = vsubps_avx(auVar8,auVar10);
  auVar100 = vsubps_avx(auVar6,auVar10);
  auVar9 = vsubps_avx(auVar9,auVar10);
  auVar5 = vmovshdup_avx(auVar11);
  local_420 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar11,auVar11,0xaa);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar11,auVar11,0xff);
  local_440 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar100);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vshufps_avx(auVar100,auVar100,0xaa);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vshufps_avx(auVar100,auVar100,0xff);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vmovshdup_avx(auVar8);
  local_460 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_480 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_4a0 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar9);
  local_4c0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  local_4e0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_500 = auVar5._0_8_;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar95 * fVar95)),_local_a60,_local_a60);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_820,_local_820);
  uVar96 = auVar5._0_4_;
  local_260._4_4_ = uVar96;
  local_260._0_4_ = uVar96;
  local_260._8_4_ = uVar96;
  local_260._12_4_ = uVar96;
  local_260._16_4_ = uVar96;
  local_260._20_4_ = uVar96;
  local_260._24_4_ = uVar96;
  local_260._28_4_ = uVar96;
  auVar244 = ZEXT3264(local_260);
  fVar95 = *(float *)(ray + k * 4 + 0x30);
  local_8d0 = ZEXT416((uint)local_300);
  local_300 = fVar95 - local_300;
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  local_c08 = 1;
  uVar90 = 0;
  bVar92 = false;
  local_520 = auVar11._0_4_;
  local_280 = auVar100._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_540 = auVar8._0_4_;
  fVar125 = auVar9._0_4_;
  auVar146._4_4_ = uStack_85c;
  auVar146._0_4_ = local_860;
  auVar146._8_4_ = uStack_858;
  auVar146._12_4_ = uStack_854;
  auVar146._16_4_ = uStack_850;
  auVar146._20_4_ = uStack_84c;
  auVar146._24_4_ = uStack_848;
  auVar146._28_4_ = uStack_844;
  local_580 = vandps_avx(local_260,auVar146);
  auVar5 = vsqrtss_avx(local_9c0,local_9c0);
  auVar6 = vsqrtss_avx(local_9c0,local_9c0);
  local_590 = ZEXT816(0x3f80000000000000);
  uStack_77c = local_780;
  uStack_778 = local_780;
  uStack_774 = local_780;
  local_770 = uVar85;
  uStack_76c = uVar85;
  uStack_768 = uVar85;
  uStack_764 = uVar85;
  local_560 = fVar125;
  fStack_55c = fVar125;
  fStack_558 = fVar125;
  fStack_554 = fVar125;
  fStack_550 = fVar125;
  fStack_54c = fVar125;
  fStack_548 = fVar125;
  fStack_544 = fVar125;
  uStack_53c = local_540;
  uStack_538 = local_540;
  uStack_534 = local_540;
  uStack_530 = local_540;
  uStack_52c = local_540;
  uStack_528 = local_540;
  uStack_524 = local_540;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  do {
    auVar192._8_4_ = 0x3f800000;
    auVar192._0_8_ = 0x3f8000003f800000;
    auVar192._12_4_ = 0x3f800000;
    auVar192._16_4_ = 0x3f800000;
    auVar192._20_4_ = 0x3f800000;
    auVar192._24_4_ = 0x3f800000;
    auVar192._28_4_ = 0x3f800000;
    iVar89 = (int)uVar90;
    auVar10 = vmovshdup_avx(local_590);
    auVar10 = vsubps_avx(auVar10,local_590);
    local_7c0._0_4_ = auVar10._0_4_;
    fVar221 = (float)local_7c0._0_4_ * 0.04761905;
    uVar96 = local_590._0_4_;
    local_940._4_4_ = uVar96;
    local_940._0_4_ = uVar96;
    local_940._8_4_ = uVar96;
    local_940._12_4_ = uVar96;
    local_940._16_4_ = uVar96;
    local_940._20_4_ = uVar96;
    local_940._24_4_ = uVar96;
    local_940._28_4_ = uVar96;
    local_7c0._4_4_ = local_7c0._0_4_;
    local_7c0._8_4_ = local_7c0._0_4_;
    local_7c0._12_4_ = local_7c0._0_4_;
    local_7c0._16_4_ = local_7c0._0_4_;
    local_7c0._20_4_ = local_7c0._0_4_;
    local_7c0._24_4_ = local_7c0._0_4_;
    local_7c0._28_4_ = local_7c0._0_4_;
    auVar10 = vfmadd231ps_fma(local_940,local_7c0,_DAT_01faff20);
    auVar113 = vsubps_avx(auVar192,ZEXT1632(auVar10));
    fVar200 = auVar113._0_4_;
    fVar217 = auVar113._4_4_;
    fVar216 = auVar113._8_4_;
    fVar259 = auVar113._12_4_;
    fVar218 = auVar113._16_4_;
    fVar277 = auVar113._20_4_;
    fVar222 = auVar113._24_4_;
    fVar97 = fVar200 * fVar200 * fVar200;
    fVar126 = fVar217 * fVar217 * fVar217;
    fVar127 = fVar216 * fVar216 * fVar216;
    fVar128 = fVar259 * fVar259 * fVar259;
    fVar129 = fVar218 * fVar218 * fVar218;
    fVar130 = fVar277 * fVar277 * fVar277;
    fVar131 = fVar222 * fVar222 * fVar222;
    fVar214 = auVar10._0_4_;
    fVar220 = auVar10._4_4_;
    fVar215 = auVar10._8_4_;
    fVar219 = auVar10._12_4_;
    fVar151 = fVar214 * fVar214 * fVar214;
    fVar179 = fVar220 * fVar220 * fVar220;
    fVar180 = fVar215 * fVar215 * fVar215;
    fVar181 = fVar219 * fVar219 * fVar219;
    fVar260 = fVar200 * fVar214;
    fVar265 = fVar217 * fVar220;
    fVar266 = fVar216 * fVar215;
    fVar267 = fVar259 * fVar219;
    fVar268 = fVar218 * 0.0;
    fVar269 = fVar277 * 0.0;
    fVar270 = fVar222 * 0.0;
    fVar276 = auVar275._28_4_ + auVar286._28_4_;
    auVar7._4_4_ = fVar126 * 0.16666667;
    auVar7._0_4_ = fVar97 * 0.16666667;
    auVar7._8_4_ = fVar127 * 0.16666667;
    auVar7._12_4_ = fVar128 * 0.16666667;
    auVar7._16_4_ = fVar129 * 0.16666667;
    auVar7._20_4_ = fVar130 * 0.16666667;
    auVar7._24_4_ = fVar131 * 0.16666667;
    auVar7._28_4_ = fVar276 + (float)local_7c0._0_4_;
    auVar13._4_4_ =
         (fVar217 * fVar265 * 12.0 + fVar265 * fVar220 * 6.0 + fVar179 + fVar126 * 4.0) * 0.16666667
    ;
    auVar13._0_4_ =
         (fVar200 * fVar260 * 12.0 + fVar260 * fVar214 * 6.0 + fVar151 + fVar97 * 4.0) * 0.16666667;
    auVar13._8_4_ =
         (fVar216 * fVar266 * 12.0 + fVar266 * fVar215 * 6.0 + fVar180 + fVar127 * 4.0) * 0.16666667
    ;
    auVar13._12_4_ =
         (fVar259 * fVar267 * 12.0 + fVar267 * fVar219 * 6.0 + fVar181 + fVar128 * 4.0) * 0.16666667
    ;
    auVar13._16_4_ =
         (fVar218 * fVar268 * 12.0 + fVar268 * 0.0 * 6.0 + fVar129 * 4.0 + 0.0) * 0.16666667;
    auVar13._20_4_ =
         (fVar277 * fVar269 * 12.0 + fVar269 * 0.0 * 6.0 + fVar130 * 4.0 + 0.0) * 0.16666667;
    auVar13._24_4_ =
         (fVar222 * fVar270 * 12.0 + fVar270 * 0.0 * 6.0 + fVar131 * 4.0 + 0.0) * 0.16666667;
    auVar13._28_4_ = auVar281._28_4_;
    auVar15._4_4_ =
         (fVar179 * 4.0 + fVar126 + fVar265 * fVar220 * 12.0 + fVar217 * fVar265 * 6.0) * 0.16666667
    ;
    auVar15._0_4_ =
         (fVar151 * 4.0 + fVar97 + fVar260 * fVar214 * 12.0 + fVar200 * fVar260 * 6.0) * 0.16666667;
    auVar15._8_4_ =
         (fVar180 * 4.0 + fVar127 + fVar266 * fVar215 * 12.0 + fVar216 * fVar266 * 6.0) * 0.16666667
    ;
    auVar15._12_4_ =
         (fVar181 * 4.0 + fVar128 + fVar267 * fVar219 * 12.0 + fVar259 * fVar267 * 6.0) * 0.16666667
    ;
    auVar15._16_4_ = (fVar129 + 0.0 + fVar268 * 0.0 * 12.0 + fVar218 * fVar268 * 6.0) * 0.16666667;
    auVar15._20_4_ = (fVar130 + 0.0 + fVar269 * 0.0 * 12.0 + fVar277 * fVar269 * 6.0) * 0.16666667;
    auVar15._24_4_ = (fVar131 + 0.0 + fVar270 * 0.0 * 12.0 + fVar222 * fVar270 * 6.0) * 0.16666667;
    auVar15._28_4_ = auVar286._28_4_;
    fVar151 = fVar151 * 0.16666667;
    fVar179 = fVar179 * 0.16666667;
    fVar180 = fVar180 * 0.16666667;
    fVar181 = fVar181 * 0.16666667;
    auVar118._4_4_ = fVar179 * fStack_55c;
    auVar118._0_4_ = fVar151 * local_560;
    auVar118._8_4_ = fVar180 * fStack_558;
    auVar118._12_4_ = fVar181 * fStack_554;
    auVar118._16_4_ = fStack_550 * 0.0;
    auVar118._20_4_ = fStack_54c * 0.0;
    auVar118._24_4_ = fStack_548 * 0.0;
    auVar118._28_4_ = local_7c0._0_4_;
    auVar16._4_4_ = fVar179 * local_4c0._4_4_;
    auVar16._0_4_ = fVar151 * (float)local_4c0;
    auVar16._8_4_ = fVar180 * (float)uStack_4b8;
    auVar16._12_4_ = fVar181 * uStack_4b8._4_4_;
    auVar16._16_4_ = (float)uStack_4b0 * 0.0;
    auVar16._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar16._24_4_ = (float)uStack_4a8 * 0.0;
    auVar16._28_4_ = fVar276 + DAT_01faff20._28_4_ + 0.0;
    auVar255._4_4_ = fVar179 * local_4e0._4_4_;
    auVar255._0_4_ = fVar151 * (float)local_4e0;
    auVar255._8_4_ = fVar180 * (float)uStack_4d8;
    auVar255._12_4_ = fVar181 * uStack_4d8._4_4_;
    auVar255._16_4_ = (float)uStack_4d0 * 0.0;
    auVar255._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar255._24_4_ = (float)uStack_4c8 * 0.0;
    auVar255._28_4_ = 0;
    auVar17._4_4_ = fVar179 * local_500._4_4_;
    auVar17._0_4_ = fVar151 * (float)local_500;
    auVar17._8_4_ = fVar180 * (float)uStack_4f8;
    auVar17._12_4_ = fVar181 * uStack_4f8._4_4_;
    auVar17._16_4_ = (float)uStack_4f0 * 0.0;
    auVar17._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_4e8 * 0.0;
    auVar17._28_4_ = 0x40c00000;
    auVar114._4_4_ = uStack_53c;
    auVar114._0_4_ = local_540;
    auVar114._8_4_ = uStack_538;
    auVar114._12_4_ = uStack_534;
    auVar114._16_4_ = uStack_530;
    auVar114._20_4_ = uStack_52c;
    auVar114._24_4_ = uStack_528;
    auVar114._28_4_ = uStack_524;
    auVar10 = vfmadd231ps_fma(auVar118,auVar15,auVar114);
    auVar70._8_8_ = uStack_458;
    auVar70._0_8_ = local_460;
    auVar70._16_8_ = uStack_450;
    auVar70._24_8_ = uStack_448;
    auVar99 = vfmadd231ps_fma(auVar16,auVar15,auVar70);
    auVar68._8_8_ = uStack_478;
    auVar68._0_8_ = local_480;
    auVar68._16_8_ = uStack_470;
    auVar68._24_8_ = uStack_468;
    auVar152 = vfmadd231ps_fma(auVar255,auVar15,auVar68);
    auVar66._8_8_ = uStack_498;
    auVar66._0_8_ = local_4a0;
    auVar66._16_8_ = uStack_490;
    auVar66._24_8_ = uStack_488;
    auVar107 = vfmadd231ps_fma(auVar17,auVar15,auVar66);
    auVar79._4_4_ = uStack_27c;
    auVar79._0_4_ = local_280;
    auVar79._8_4_ = uStack_278;
    auVar79._12_4_ = uStack_274;
    auVar79._16_4_ = uStack_270;
    auVar79._20_4_ = uStack_26c;
    auVar79._24_4_ = uStack_268;
    auVar79._28_4_ = uStack_264;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar13,auVar79);
    auVar82._8_8_ = uStack_1f8;
    auVar82._0_8_ = local_200;
    auVar82._16_8_ = uStack_1f0;
    auVar82._24_8_ = uStack_1e8;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar13,auVar82);
    auVar81._8_8_ = uStack_218;
    auVar81._0_8_ = local_220;
    auVar81._16_8_ = uStack_210;
    auVar81._24_8_ = uStack_208;
    auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar13,auVar81);
    auVar80._8_8_ = uStack_238;
    auVar80._0_8_ = local_240;
    auVar80._16_8_ = uStack_230;
    auVar80._24_8_ = uStack_228;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar80,auVar13);
    auVar64._4_4_ = uStack_51c;
    auVar64._0_4_ = local_520;
    auVar64._8_4_ = uStack_518;
    auVar64._12_4_ = uStack_514;
    auVar64._16_4_ = uStack_510;
    auVar64._20_4_ = uStack_50c;
    auVar64._24_4_ = uStack_508;
    auVar64._28_4_ = uStack_504;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar7,auVar64);
    auVar114 = ZEXT1632(auVar10);
    auVar74._8_8_ = uStack_418;
    auVar74._0_8_ = local_420;
    auVar74._16_8_ = uStack_410;
    auVar74._24_8_ = uStack_408;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar7,auVar74);
    local_960 = ZEXT1632(auVar99);
    auVar83._8_8_ = uStack_1d8;
    auVar83._0_8_ = local_1e0;
    auVar83._16_8_ = uStack_1d0;
    auVar83._24_8_ = uStack_1c8;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar7,auVar83);
    auVar72._8_8_ = uStack_438;
    auVar72._0_8_ = local_440;
    auVar72._16_8_ = uStack_430;
    auVar72._24_8_ = uStack_428;
    auVar152 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar7,auVar72);
    auVar235._0_4_ = (float)((uint)fVar214 ^ local_680) * fVar214;
    auVar235._4_4_ = (float)((uint)fVar220 ^ uStack_67c) * fVar220;
    auVar235._8_4_ = (float)((uint)fVar215 ^ uStack_678) * fVar215;
    auVar235._12_4_ = (float)((uint)fVar219 ^ uStack_674) * fVar219;
    auVar235._16_4_ = fStack_670 * 0.0;
    auVar235._20_4_ = fStack_66c * 0.0;
    auVar235._24_4_ = fStack_668 * 0.0;
    auVar235._28_4_ = 0;
    auVar18._4_4_ = fVar265 * 4.0;
    auVar18._0_4_ = fVar260 * 4.0;
    auVar18._8_4_ = fVar266 * 4.0;
    auVar18._12_4_ = fVar267 * 4.0;
    auVar18._16_4_ = fVar268 * 4.0;
    auVar18._20_4_ = fVar269 * 4.0;
    fVar97 = auVar264._28_4_;
    auVar18._24_4_ = fVar270 * 4.0;
    auVar18._28_4_ = fVar97;
    auVar146 = vsubps_avx(auVar235,auVar18);
    auVar19._4_4_ = fVar217 * (float)((uint)fVar217 ^ uStack_67c) * 0.5;
    auVar19._0_4_ = fVar200 * (float)((uint)fVar200 ^ local_680) * 0.5;
    auVar19._8_4_ = fVar216 * (float)((uint)fVar216 ^ uStack_678) * 0.5;
    auVar19._12_4_ = fVar259 * (float)((uint)fVar259 ^ uStack_674) * 0.5;
    auVar19._16_4_ = fVar218 * (float)((uint)fVar218 ^ (uint)fStack_670) * 0.5;
    auVar19._20_4_ = fVar277 * (float)((uint)fVar277 ^ (uint)fStack_66c) * 0.5;
    auVar19._24_4_ = fVar222 * (float)((uint)fVar222 ^ (uint)fStack_668) * 0.5;
    auVar19._28_4_ = auVar113._28_4_;
    auVar20._4_4_ = auVar146._4_4_ * 0.5;
    auVar20._0_4_ = auVar146._0_4_ * 0.5;
    auVar20._8_4_ = auVar146._8_4_ * 0.5;
    auVar20._12_4_ = auVar146._12_4_ * 0.5;
    auVar20._16_4_ = auVar146._16_4_ * 0.5;
    auVar20._20_4_ = auVar146._20_4_ * 0.5;
    auVar20._24_4_ = auVar146._24_4_ * 0.5;
    auVar20._28_4_ = auVar146._28_4_;
    auVar212._4_4_ = (fVar265 * 4.0 + fVar217 * fVar217) * 0.5;
    auVar212._0_4_ = (fVar260 * 4.0 + fVar200 * fVar200) * 0.5;
    auVar212._8_4_ = (fVar266 * 4.0 + fVar216 * fVar216) * 0.5;
    auVar212._12_4_ = (fVar267 * 4.0 + fVar259 * fVar259) * 0.5;
    auVar212._16_4_ = (fVar268 * 4.0 + fVar218 * fVar218) * 0.5;
    auVar212._20_4_ = (fVar269 * 4.0 + fVar277 * fVar277) * 0.5;
    auVar212._24_4_ = (fVar270 * 4.0 + fVar222 * fVar222) * 0.5;
    auVar212._28_4_ = fVar97 + auVar244._28_4_;
    fVar200 = fVar214 * fVar214 * 0.5;
    fVar214 = fVar220 * fVar220 * 0.5;
    fVar217 = fVar215 * fVar215 * 0.5;
    fVar220 = fVar219 * fVar219 * 0.5;
    auVar21._4_4_ = fVar214 * fStack_55c;
    auVar21._0_4_ = fVar200 * local_560;
    auVar21._8_4_ = fVar217 * fStack_558;
    auVar21._12_4_ = fVar220 * fStack_554;
    auVar21._16_4_ = fStack_550 * 0.0;
    auVar21._20_4_ = fStack_54c * 0.0;
    auVar21._24_4_ = fStack_548 * 0.0;
    auVar21._28_4_ = fVar97;
    auVar22._4_4_ = fVar214 * local_4c0._4_4_;
    auVar22._0_4_ = fVar200 * (float)local_4c0;
    auVar22._8_4_ = fVar217 * (float)uStack_4b8;
    auVar22._12_4_ = fVar220 * uStack_4b8._4_4_;
    auVar22._16_4_ = (float)uStack_4b0 * 0.0;
    auVar22._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar22._24_4_ = (float)uStack_4a8 * 0.0;
    auVar22._28_4_ = uStack_664;
    auVar23._4_4_ = fVar214 * local_4e0._4_4_;
    auVar23._0_4_ = fVar200 * (float)local_4e0;
    auVar23._8_4_ = fVar217 * (float)uStack_4d8;
    auVar23._12_4_ = fVar220 * uStack_4d8._4_4_;
    auVar23._16_4_ = (float)uStack_4d0 * 0.0;
    auVar23._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar23._24_4_ = (float)uStack_4c8 * 0.0;
    auVar23._28_4_ = auVar281._28_4_;
    auVar169._4_4_ = fVar214 * local_500._4_4_;
    auVar169._0_4_ = fVar200 * (float)local_500;
    auVar169._8_4_ = fVar217 * (float)uStack_4f8;
    auVar169._12_4_ = fVar220 * uStack_4f8._4_4_;
    auVar169._16_4_ = (float)uStack_4f0 * 0.0;
    auVar169._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar169._24_4_ = (float)uStack_4e8 * 0.0;
    auVar169._28_4_ = 0;
    auVar63._4_4_ = uStack_53c;
    auVar63._0_4_ = local_540;
    auVar63._8_4_ = uStack_538;
    auVar63._12_4_ = uStack_534;
    auVar63._16_4_ = uStack_530;
    auVar63._20_4_ = uStack_52c;
    auVar63._24_4_ = uStack_528;
    auVar63._28_4_ = uStack_524;
    auVar107 = vfmadd231ps_fma(auVar21,auVar212,auVar63);
    auVar71._8_8_ = uStack_458;
    auVar71._0_8_ = local_460;
    auVar71._16_8_ = uStack_450;
    auVar71._24_8_ = uStack_448;
    auVar102 = vfmadd231ps_fma(auVar22,auVar212,auVar71);
    auVar69._8_8_ = uStack_478;
    auVar69._0_8_ = local_480;
    auVar69._16_8_ = uStack_470;
    auVar69._24_8_ = uStack_468;
    auVar133 = vfmadd231ps_fma(auVar23,auVar212,auVar69);
    auVar67._8_8_ = uStack_498;
    auVar67._0_8_ = local_4a0;
    auVar67._16_8_ = uStack_490;
    auVar67._24_8_ = uStack_488;
    auVar164 = vfmadd231ps_fma(auVar169,auVar212,auVar67);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar20,auVar79);
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar20,auVar82);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar20,auVar81);
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar80,auVar20);
    auVar65._4_4_ = uStack_51c;
    auVar65._0_4_ = local_520;
    auVar65._8_4_ = uStack_518;
    auVar65._12_4_ = uStack_514;
    auVar65._16_4_ = uStack_510;
    auVar65._20_4_ = uStack_50c;
    auVar65._24_4_ = uStack_508;
    auVar65._28_4_ = uStack_504;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar19,auVar65);
    auVar75._8_8_ = uStack_418;
    auVar75._0_8_ = local_420;
    auVar75._16_8_ = uStack_410;
    auVar75._24_8_ = uStack_408;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar19,auVar75);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar19,auVar83);
    auVar73._8_8_ = uStack_438;
    auVar73._0_8_ = local_440;
    auVar73._16_8_ = uStack_430;
    auVar73._24_8_ = uStack_428;
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar19,auVar73);
    auVar263._0_4_ = auVar107._0_4_ * fVar221;
    auVar263._4_4_ = auVar107._4_4_ * fVar221;
    auVar263._8_4_ = auVar107._8_4_ * fVar221;
    auVar263._12_4_ = auVar107._12_4_ * fVar221;
    auVar263._16_4_ = fVar221 * 0.0;
    auVar263._20_4_ = fVar221 * 0.0;
    auVar263._24_4_ = fVar221 * 0.0;
    auVar263._28_4_ = 0;
    fVar200 = auVar102._0_4_ * fVar221;
    fVar214 = auVar102._4_4_ * fVar221;
    local_9e0._4_4_ = fVar214;
    local_9e0._0_4_ = fVar200;
    fVar217 = auVar102._8_4_ * fVar221;
    local_9e0._8_4_ = fVar217;
    fVar220 = auVar102._12_4_ * fVar221;
    local_9e0._12_4_ = fVar220;
    local_9e0._16_4_ = fVar221 * 0.0;
    local_9e0._20_4_ = fVar221 * 0.0;
    local_9e0._24_4_ = fVar221 * 0.0;
    local_9e0._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    fVar131 = auVar133._0_4_ * fVar221;
    fVar151 = auVar133._4_4_ * fVar221;
    auVar280._4_4_ = fVar151;
    auVar280._0_4_ = fVar131;
    fVar179 = auVar133._8_4_ * fVar221;
    auVar280._8_4_ = fVar179;
    fVar180 = auVar133._12_4_ * fVar221;
    auVar280._12_4_ = fVar180;
    fVar181 = fVar221 * 0.0;
    auVar280._16_4_ = fVar181;
    fVar260 = fVar221 * 0.0;
    auVar280._20_4_ = fVar260;
    uVar96 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    fVar265 = fVar221 * 0.0;
    auVar280._24_4_ = fVar265;
    auVar280._28_4_ = uVar96;
    auVar210._0_4_ = fVar221 * auVar164._0_4_;
    auVar210._4_4_ = fVar221 * auVar164._4_4_;
    auVar210._8_4_ = fVar221 * auVar164._8_4_;
    auVar210._12_4_ = fVar221 * auVar164._12_4_;
    auVar210._16_4_ = fVar221 * 0.0;
    auVar210._20_4_ = fVar221 * 0.0;
    auVar210._24_4_ = fVar221 * 0.0;
    auVar210._28_4_ = 0;
    auVar20 = vpermps_avx2(_DAT_01fec480,auVar114);
    auVar212 = vpermps_avx2(_DAT_01fec480,local_960);
    auVar169 = ZEXT1632(auVar10);
    local_7a0 = vpermps_avx2(_DAT_01fec480,auVar169);
    auVar15 = vsubps_avx(auVar20,auVar114);
    auVar118 = vsubps_avx(local_7a0,ZEXT1632(auVar10));
    fVar219 = auVar118._0_4_;
    fVar218 = auVar118._4_4_;
    auVar298._4_4_ = fVar218 * auVar263._4_4_;
    auVar298._0_4_ = fVar219 * auVar263._0_4_;
    fVar222 = auVar118._8_4_;
    auVar298._8_4_ = fVar222 * auVar263._8_4_;
    fVar97 = auVar118._12_4_;
    auVar298._12_4_ = fVar97 * auVar263._12_4_;
    fVar126 = auVar118._16_4_;
    auVar298._16_4_ = fVar126 * auVar263._16_4_;
    fVar127 = auVar118._20_4_;
    auVar298._20_4_ = fVar127 * auVar263._20_4_;
    fVar128 = auVar118._24_4_;
    auVar298._24_4_ = fVar128 * auVar263._24_4_;
    auVar298._28_4_ = auVar20._28_4_;
    auVar10 = vfmsub231ps_fma(auVar298,auVar280,auVar15);
    auVar16 = vsubps_avx(auVar212,local_960);
    fVar269 = auVar15._0_4_;
    fVar270 = auVar15._4_4_;
    auVar241._4_4_ = fVar270 * fVar214;
    auVar241._0_4_ = fVar269 * fVar200;
    fVar276 = auVar15._8_4_;
    auVar241._8_4_ = fVar276 * fVar217;
    fVar293 = auVar15._12_4_;
    auVar241._12_4_ = fVar293 * fVar220;
    fVar294 = auVar15._16_4_;
    auVar241._16_4_ = fVar294 * fVar221 * 0.0;
    fVar295 = auVar15._20_4_;
    auVar241._20_4_ = fVar295 * fVar221 * 0.0;
    fVar296 = auVar15._24_4_;
    auVar241._24_4_ = fVar296 * fVar221 * 0.0;
    auVar241._28_4_ = auVar212._28_4_;
    auVar107 = vfmsub231ps_fma(auVar241,auVar263,auVar16);
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar107._12_4_ * auVar107._12_4_,
                                                 CONCAT48(auVar107._8_4_ * auVar107._8_4_,
                                                          CONCAT44(auVar107._4_4_ * auVar107._4_4_,
                                                                   auVar107._0_4_ * auVar107._0_4_))
                                                )),ZEXT1632(auVar10),ZEXT1632(auVar10));
    fVar277 = auVar16._0_4_;
    fVar221 = auVar16._4_4_;
    auVar12._4_4_ = fVar221 * fVar151;
    auVar12._0_4_ = fVar277 * fVar131;
    fVar129 = auVar16._8_4_;
    auVar12._8_4_ = fVar129 * fVar179;
    fVar130 = auVar16._12_4_;
    auVar12._12_4_ = fVar130 * fVar180;
    fVar266 = auVar16._16_4_;
    auVar12._16_4_ = fVar266 * fVar181;
    fVar267 = auVar16._20_4_;
    auVar12._20_4_ = fVar267 * fVar260;
    fVar268 = auVar16._24_4_;
    auVar12._24_4_ = fVar268 * fVar265;
    auVar12._28_4_ = local_7a0._28_4_;
    auVar102 = vfmsub231ps_fma(auVar12,local_9e0,auVar118);
    auVar193._0_4_ = fVar219 * fVar219;
    auVar193._4_4_ = fVar218 * fVar218;
    auVar193._8_4_ = fVar222 * fVar222;
    auVar193._12_4_ = fVar97 * fVar97;
    auVar193._16_4_ = fVar126 * fVar126;
    auVar193._20_4_ = fVar127 * fVar127;
    auVar193._24_4_ = fVar128 * fVar128;
    auVar193._28_4_ = 0;
    auVar107 = vfmadd231ps_fma(auVar193,auVar16,auVar16);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar15,auVar15);
    auVar113 = vrcpps_avx(ZEXT1632(auVar107));
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar102),ZEXT1632(auVar102));
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = 0x3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar10 = vfnmadd213ps_fma(auVar113,ZEXT1632(auVar107),auVar115);
    auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar113,auVar113);
    local_a00 = vpermps_avx2(_DAT_01fec480,auVar263);
    auVar21 = vpermps_avx2(_DAT_01fec480,auVar280);
    auVar14._4_4_ = fVar218 * local_a00._4_4_;
    auVar14._0_4_ = fVar219 * local_a00._0_4_;
    auVar14._8_4_ = fVar222 * local_a00._8_4_;
    auVar14._12_4_ = fVar97 * local_a00._12_4_;
    auVar14._16_4_ = fVar126 * local_a00._16_4_;
    auVar14._20_4_ = fVar127 * local_a00._20_4_;
    auVar14._24_4_ = fVar128 * local_a00._24_4_;
    auVar14._28_4_ = auVar113._28_4_;
    auVar133 = vfmsub231ps_fma(auVar14,auVar21,auVar15);
    local_a20 = vpermps_avx2(_DAT_01fec480,local_9e0);
    auVar26._4_4_ = fVar270 * local_a20._4_4_;
    auVar26._0_4_ = fVar269 * local_a20._0_4_;
    auVar26._8_4_ = fVar276 * local_a20._8_4_;
    auVar26._12_4_ = fVar293 * local_a20._12_4_;
    auVar26._16_4_ = fVar294 * local_a20._16_4_;
    auVar26._20_4_ = fVar295 * local_a20._20_4_;
    auVar26._24_4_ = fVar296 * local_a20._24_4_;
    auVar26._28_4_ = 0;
    auVar164 = vfmsub231ps_fma(auVar26,local_a00,auVar16);
    auVar133 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                                  CONCAT48(auVar164._8_4_ * auVar164._8_4_,
                                                           CONCAT44(auVar164._4_4_ * auVar164._4_4_,
                                                                    auVar164._0_4_ * auVar164._0_4_)
                                                          ))),ZEXT1632(auVar133),ZEXT1632(auVar133))
    ;
    auVar248._0_4_ = fVar277 * auVar21._0_4_;
    auVar248._4_4_ = fVar221 * auVar21._4_4_;
    auVar248._8_4_ = fVar129 * auVar21._8_4_;
    auVar248._12_4_ = fVar130 * auVar21._12_4_;
    auVar248._16_4_ = fVar266 * auVar21._16_4_;
    auVar248._20_4_ = fVar267 * auVar21._20_4_;
    auVar248._24_4_ = fVar268 * auVar21._24_4_;
    auVar248._28_4_ = 0;
    auVar164 = vfmsub231ps_fma(auVar248,local_a20,auVar118);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT1632(auVar164),ZEXT1632(auVar164));
    auVar113 = vmaxps_avx(ZEXT1632(CONCAT412(auVar102._12_4_ * auVar10._12_4_,
                                             CONCAT48(auVar102._8_4_ * auVar10._8_4_,
                                                      CONCAT44(auVar102._4_4_ * auVar10._4_4_,
                                                               auVar102._0_4_ * auVar10._0_4_)))),
                          ZEXT1632(CONCAT412(auVar133._12_4_ * auVar10._12_4_,
                                             CONCAT48(auVar133._8_4_ * auVar10._8_4_,
                                                      CONCAT44(auVar133._4_4_ * auVar10._4_4_,
                                                               auVar133._0_4_ * auVar10._0_4_)))));
    auVar234._0_4_ = auVar152._0_4_ + auVar210._0_4_;
    auVar234._4_4_ = auVar152._4_4_ + auVar210._4_4_;
    auVar234._8_4_ = auVar152._8_4_ + auVar210._8_4_;
    auVar234._12_4_ = auVar152._12_4_ + auVar210._12_4_;
    auVar234._16_4_ = auVar210._16_4_ + 0.0;
    auVar234._20_4_ = auVar210._20_4_ + 0.0;
    auVar234._24_4_ = auVar210._24_4_ + 0.0;
    local_800._28_4_ = 0;
    local_800._0_28_ = auVar234;
    auVar236._12_4_ = 0;
    auVar236._0_12_ = auVar234._16_12_;
    local_7e0 = ZEXT1632(auVar152);
    auVar146 = vsubps_avx(local_7e0,auVar210);
    auVar22 = vpermps_avx2(_DAT_01fec480,auVar146);
    auVar23 = vpermps_avx2(_DAT_01fec480,local_7e0);
    auVar146 = vmaxps_avx(local_7e0,local_800);
    auVar7 = vmaxps_avx(auVar22,auVar23);
    auVar13 = vrsqrtps_avx(ZEXT1632(auVar107));
    auVar146 = vmaxps_avx(auVar146,auVar7);
    fVar200 = auVar13._0_4_;
    fVar214 = auVar13._4_4_;
    fVar217 = auVar13._8_4_;
    fVar220 = auVar13._12_4_;
    fVar216 = auVar13._16_4_;
    fVar215 = auVar13._20_4_;
    fVar259 = auVar13._24_4_;
    auVar27._4_4_ = fVar214 * fVar214 * fVar214 * auVar107._4_4_ * -0.5;
    auVar27._0_4_ = fVar200 * fVar200 * fVar200 * auVar107._0_4_ * -0.5;
    auVar27._8_4_ = fVar217 * fVar217 * fVar217 * auVar107._8_4_ * -0.5;
    auVar27._12_4_ = fVar220 * fVar220 * fVar220 * auVar107._12_4_ * -0.5;
    auVar27._16_4_ = fVar216 * fVar216 * fVar216 * -0.0;
    auVar27._20_4_ = fVar215 * fVar215 * fVar215 * -0.0;
    auVar27._24_4_ = fVar259 * fVar259 * fVar259 * -0.0;
    auVar27._28_4_ = auVar22._28_4_;
    auVar140._8_4_ = 0x3fc00000;
    auVar140._0_8_ = 0x3fc000003fc00000;
    auVar140._12_4_ = 0x3fc00000;
    auVar140._16_4_ = 0x3fc00000;
    auVar140._20_4_ = 0x3fc00000;
    auVar140._24_4_ = 0x3fc00000;
    auVar140._28_4_ = 0x3fc00000;
    auVar10 = vfmadd231ps_fma(auVar27,auVar140,auVar13);
    auVar244 = ZEXT1664(auVar10);
    fVar214 = auVar10._0_4_;
    fVar220 = auVar10._4_4_;
    auVar28._4_4_ = fVar221 * fVar220;
    auVar28._0_4_ = fVar277 * fVar214;
    fVar259 = auVar10._8_4_;
    auVar28._8_4_ = fVar129 * fVar259;
    fVar277 = auVar10._12_4_;
    auVar28._12_4_ = fVar130 * fVar277;
    auVar28._16_4_ = fVar266 * 0.0;
    auVar28._20_4_ = fVar267 * 0.0;
    auVar28._24_4_ = fVar268 * 0.0;
    auVar28._28_4_ = 0;
    auVar29._4_4_ = (float)local_980._4_4_ * fVar218 * fVar220;
    auVar29._0_4_ = (float)local_980._0_4_ * fVar219 * fVar214;
    auVar29._8_4_ = fStack_978 * fVar222 * fVar259;
    auVar29._12_4_ = fStack_974 * fVar97 * fVar277;
    auVar29._16_4_ = fStack_970 * fVar126 * 0.0;
    auVar29._20_4_ = fStack_96c * fVar127 * 0.0;
    auVar29._24_4_ = fStack_968 * fVar128 * 0.0;
    auVar29._28_4_ = auVar16._28_4_;
    auVar152 = vfmadd231ps_fma(auVar29,auVar28,_local_a60);
    auVar7 = vsubps_avx(ZEXT832(0) << 0x20,auVar169);
    fVar217 = auVar7._0_4_;
    auVar297._0_4_ = fVar219 * fVar214 * fVar217;
    fVar216 = auVar7._4_4_;
    auVar297._4_4_ = fVar218 * fVar220 * fVar216;
    fVar219 = auVar7._8_4_;
    auVar297._8_4_ = fVar222 * fVar259 * fVar219;
    fVar222 = auVar7._12_4_;
    auVar297._12_4_ = fVar97 * fVar277 * fVar222;
    fVar97 = auVar7._16_4_;
    auVar297._16_4_ = fVar126 * 0.0 * fVar97;
    fVar126 = auVar7._20_4_;
    auVar297._20_4_ = fVar127 * 0.0 * fVar126;
    fVar127 = auVar7._24_4_;
    auVar297._24_4_ = fVar128 * 0.0 * fVar127;
    auVar297._28_4_ = 0;
    auVar255 = vsubps_avx(ZEXT832(0) << 0x20,local_960);
    auVar275 = ZEXT3264(auVar255);
    auVar107 = vfmadd231ps_fma(auVar297,auVar255,auVar28);
    auVar30._4_4_ = fVar270 * fVar220;
    auVar30._0_4_ = fVar269 * fVar214;
    auVar30._8_4_ = fVar276 * fVar259;
    auVar30._12_4_ = fVar293 * fVar277;
    auVar30._16_4_ = fVar294 * 0.0;
    auVar30._20_4_ = fVar295 * 0.0;
    auVar30._24_4_ = fVar296 * 0.0;
    auVar30._28_4_ = 0;
    auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar30,_local_820);
    auVar281 = ZEXT1664(auVar152);
    auVar17 = vsubps_avx(ZEXT832(0) << 0x20,auVar114);
    auVar286 = ZEXT3264(auVar17);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar17,auVar30);
    auVar31._4_4_ = (float)local_980._4_4_ * fVar216;
    auVar31._0_4_ = (float)local_980._0_4_ * fVar217;
    auVar31._8_4_ = fStack_978 * fVar219;
    auVar31._12_4_ = fStack_974 * fVar222;
    auVar31._16_4_ = fStack_970 * fVar97;
    auVar31._20_4_ = fStack_96c * fVar126;
    auVar31._24_4_ = fStack_968 * fVar127;
    auVar31._28_4_ = 0;
    auVar102 = vfmadd231ps_fma(auVar31,_local_a60,auVar255);
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),_local_820,auVar17);
    fVar200 = auVar107._0_4_;
    fVar266 = auVar152._0_4_;
    fVar215 = auVar107._4_4_;
    fVar267 = auVar152._4_4_;
    fVar218 = auVar107._8_4_;
    fVar268 = auVar152._8_4_;
    fVar221 = auVar107._12_4_;
    fVar269 = auVar152._12_4_;
    auVar32._28_4_ = auVar13._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(fVar269 * fVar221,
                            CONCAT48(fVar268 * fVar218,CONCAT44(fVar267 * fVar215,fVar266 * fVar200)
                                    )));
    auVar18 = vsubps_avx(ZEXT1632(auVar102),auVar32);
    auVar33._4_4_ = fVar216 * fVar216;
    auVar33._0_4_ = fVar217 * fVar217;
    auVar33._8_4_ = fVar219 * fVar219;
    auVar33._12_4_ = fVar222 * fVar222;
    auVar33._16_4_ = fVar97 * fVar97;
    auVar33._20_4_ = fVar126 * fVar126;
    auVar33._24_4_ = fVar127 * fVar127;
    auVar33._28_4_ = auVar13._28_4_;
    auVar102 = vfmadd231ps_fma(auVar33,auVar255,auVar255);
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar17,auVar17);
    auVar34._28_4_ = auVar15._28_4_;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(fVar221 * fVar221,
                            CONCAT48(fVar218 * fVar218,CONCAT44(fVar215 * fVar215,fVar200 * fVar200)
                                    )));
    auVar13 = vsubps_avx(ZEXT1632(auVar102),auVar34);
    auVar7 = vsqrtps_avx(auVar113);
    fVar200 = (auVar7._0_4_ + auVar146._0_4_) * 1.0000002;
    fVar215 = (auVar7._4_4_ + auVar146._4_4_) * 1.0000002;
    fVar218 = (auVar7._8_4_ + auVar146._8_4_) * 1.0000002;
    fVar221 = (auVar7._12_4_ + auVar146._12_4_) * 1.0000002;
    fVar128 = (auVar7._16_4_ + auVar146._16_4_) * 1.0000002;
    fVar129 = (auVar7._20_4_ + auVar146._20_4_) * 1.0000002;
    fVar130 = (auVar7._24_4_ + auVar146._24_4_) * 1.0000002;
    auVar35._4_4_ = fVar215 * fVar215;
    auVar35._0_4_ = fVar200 * fVar200;
    auVar35._8_4_ = fVar218 * fVar218;
    auVar35._12_4_ = fVar221 * fVar221;
    auVar35._16_4_ = fVar128 * fVar128;
    auVar35._20_4_ = fVar129 * fVar129;
    auVar35._24_4_ = fVar130 * fVar130;
    auVar35._28_4_ = auVar7._28_4_ + auVar146._28_4_;
    local_2c0._0_4_ = auVar18._0_4_ + auVar18._0_4_;
    local_2c0._4_4_ = auVar18._4_4_ + auVar18._4_4_;
    local_2c0._8_4_ = auVar18._8_4_ + auVar18._8_4_;
    local_2c0._12_4_ = auVar18._12_4_ + auVar18._12_4_;
    local_2c0._16_4_ = auVar18._16_4_ + auVar18._16_4_;
    local_2c0._20_4_ = auVar18._20_4_ + auVar18._20_4_;
    local_2c0._24_4_ = auVar18._24_4_ + auVar18._24_4_;
    local_2c0._28_4_ = auVar18._28_4_ + auVar18._28_4_;
    auVar146 = vsubps_avx(auVar13,auVar35);
    auVar280 = ZEXT1632(auVar152);
    local_2a0._28_4_ = 0x3f800002;
    local_2a0._0_28_ =
         ZEXT1628(CONCAT412(fVar269 * fVar269,
                            CONCAT48(fVar268 * fVar268,CONCAT44(fVar267 * fVar267,fVar266 * fVar266)
                                    )));
    auVar18 = vsubps_avx(local_260,local_2a0);
    auVar249._0_4_ = local_2c0._0_4_ * local_2c0._0_4_;
    auVar249._4_4_ = local_2c0._4_4_ * local_2c0._4_4_;
    auVar249._8_4_ = local_2c0._8_4_ * local_2c0._8_4_;
    auVar249._12_4_ = local_2c0._12_4_ * local_2c0._12_4_;
    auVar249._16_4_ = local_2c0._16_4_ * local_2c0._16_4_;
    auVar249._20_4_ = local_2c0._20_4_ * local_2c0._20_4_;
    auVar249._24_4_ = local_2c0._24_4_ * local_2c0._24_4_;
    auVar249._28_4_ = 0;
    fVar215 = auVar18._0_4_;
    fVar218 = auVar18._4_4_;
    fVar221 = auVar18._8_4_;
    fVar128 = auVar18._12_4_;
    fVar129 = auVar18._16_4_;
    fVar130 = auVar18._20_4_;
    fVar266 = auVar18._24_4_;
    auVar36._4_4_ = fVar218 * 4.0 * auVar146._4_4_;
    auVar36._0_4_ = fVar215 * 4.0 * auVar146._0_4_;
    auVar36._8_4_ = fVar221 * 4.0 * auVar146._8_4_;
    auVar36._12_4_ = fVar128 * 4.0 * auVar146._12_4_;
    auVar36._16_4_ = fVar129 * 4.0 * auVar146._16_4_;
    auVar36._20_4_ = fVar130 * 4.0 * auVar146._20_4_;
    auVar36._24_4_ = fVar266 * 4.0 * auVar146._24_4_;
    auVar36._28_4_ = 0x40800000;
    auVar19 = vsubps_avx(auVar249,auVar36);
    auVar113 = vcmpps_avx(auVar19,ZEXT432(0) << 0x20,5);
    auVar298 = ZEXT1632(auVar107);
    fVar200 = auVar18._28_4_;
    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar113 >> 0x7f,0) == '\0') &&
          (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar113 >> 0xbf,0) == '\0') &&
        (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar113[0x1f])
    {
      auVar250._8_4_ = 0x7f800000;
      auVar250._0_8_ = 0x7f8000007f800000;
      auVar250._12_4_ = 0x7f800000;
      auVar250._16_4_ = 0x7f800000;
      auVar250._20_4_ = 0x7f800000;
      auVar250._24_4_ = 0x7f800000;
      auVar250._28_4_ = 0x7f800000;
      auVar194._8_4_ = 0xff800000;
      auVar194._0_8_ = 0xff800000ff800000;
      auVar194._12_4_ = 0xff800000;
      auVar194._16_4_ = 0xff800000;
      auVar194._20_4_ = 0xff800000;
      auVar194._24_4_ = 0xff800000;
      auVar194._28_4_ = 0xff800000;
    }
    else {
      auVar14 = vsqrtps_avx(auVar19);
      auVar287._0_4_ = fVar215 + fVar215;
      auVar287._4_4_ = fVar218 + fVar218;
      auVar287._8_4_ = fVar221 + fVar221;
      auVar287._12_4_ = fVar128 + fVar128;
      auVar287._16_4_ = fVar129 + fVar129;
      auVar287._20_4_ = fVar130 + fVar130;
      auVar287._24_4_ = fVar266 + fVar266;
      auVar287._28_4_ = fVar200 + fVar200;
      auVar12 = vrcpps_avx(auVar287);
      auVar241 = vcmpps_avx(auVar19,ZEXT432(0) << 0x20,5);
      auVar195._8_4_ = 0x3f800000;
      auVar195._0_8_ = 0x3f8000003f800000;
      auVar195._12_4_ = 0x3f800000;
      auVar195._16_4_ = 0x3f800000;
      auVar195._20_4_ = 0x3f800000;
      auVar195._24_4_ = 0x3f800000;
      auVar195._28_4_ = 0x3f800000;
      auVar152 = vfnmadd213ps_fma(auVar287,auVar12,auVar195);
      auVar152 = vfmadd132ps_fma(ZEXT1632(auVar152),auVar12,auVar12);
      auVar196._0_4_ = (uint)local_2c0._0_4_ ^ local_680;
      auVar196._4_4_ = (uint)local_2c0._4_4_ ^ uStack_67c;
      auVar196._8_4_ = (uint)local_2c0._8_4_ ^ uStack_678;
      auVar196._12_4_ = (uint)local_2c0._12_4_ ^ uStack_674;
      auVar196._16_4_ = (uint)local_2c0._16_4_ ^ (uint)fStack_670;
      auVar196._20_4_ = (uint)local_2c0._20_4_ ^ (uint)fStack_66c;
      auVar196._24_4_ = (uint)local_2c0._24_4_ ^ (uint)fStack_668;
      auVar196._28_4_ = (uint)local_2c0._28_4_ ^ uStack_664;
      auVar19 = vsubps_avx(auVar196,auVar14);
      auVar37._4_4_ = auVar152._4_4_ * auVar19._4_4_;
      auVar37._0_4_ = auVar152._0_4_ * auVar19._0_4_;
      auVar37._8_4_ = auVar152._8_4_ * auVar19._8_4_;
      auVar37._12_4_ = auVar152._12_4_ * auVar19._12_4_;
      auVar37._16_4_ = auVar19._16_4_ * 0.0;
      auVar37._20_4_ = auVar19._20_4_ * 0.0;
      auVar37._24_4_ = auVar19._24_4_ * 0.0;
      auVar37._28_4_ = auVar19._28_4_;
      auVar19 = vsubps_avx(auVar14,local_2c0);
      auVar38._4_4_ = auVar152._4_4_ * auVar19._4_4_;
      auVar38._0_4_ = auVar152._0_4_ * auVar19._0_4_;
      auVar38._8_4_ = auVar152._8_4_ * auVar19._8_4_;
      auVar38._12_4_ = auVar152._12_4_ * auVar19._12_4_;
      auVar38._16_4_ = auVar19._16_4_ * 0.0;
      auVar38._20_4_ = auVar19._20_4_ * 0.0;
      auVar38._24_4_ = auVar19._24_4_ * 0.0;
      auVar38._28_4_ = auVar19._28_4_;
      auVar152 = vfmadd213ps_fma(auVar280,auVar37,auVar298);
      local_340 = auVar152._0_4_ * fVar214;
      fStack_33c = auVar152._4_4_ * fVar220;
      fStack_338 = auVar152._8_4_ * fVar259;
      fStack_334 = auVar152._12_4_ * fVar277;
      uStack_330 = 0;
      uStack_32c = 0;
      uStack_328 = 0;
      fStack_324 = local_2c0._28_4_;
      auVar58._4_4_ = uStack_85c;
      auVar58._0_4_ = local_860;
      auVar58._8_4_ = uStack_858;
      auVar58._12_4_ = uStack_854;
      auVar58._16_4_ = uStack_850;
      auVar58._20_4_ = uStack_84c;
      auVar58._24_4_ = uStack_848;
      auVar58._28_4_ = uStack_844;
      auVar19 = vandps_avx(local_2a0,auVar58);
      auVar19 = vmaxps_avx(local_580,auVar19);
      auVar39._4_4_ = auVar19._4_4_ * 1.9073486e-06;
      auVar39._0_4_ = auVar19._0_4_ * 1.9073486e-06;
      auVar39._8_4_ = auVar19._8_4_ * 1.9073486e-06;
      auVar39._12_4_ = auVar19._12_4_ * 1.9073486e-06;
      auVar39._16_4_ = auVar19._16_4_ * 1.9073486e-06;
      auVar39._20_4_ = auVar19._20_4_ * 1.9073486e-06;
      auVar39._24_4_ = auVar19._24_4_ * 1.9073486e-06;
      auVar39._28_4_ = auVar19._28_4_;
      auVar19 = vandps_avx(auVar18,auVar58);
      auVar19 = vcmpps_avx(auVar19,auVar39,1);
      auVar152 = vfmadd213ps_fma(auVar280,auVar38,auVar298);
      auVar141._8_4_ = 0x7f800000;
      auVar141._0_8_ = 0x7f8000007f800000;
      auVar141._12_4_ = 0x7f800000;
      auVar141._16_4_ = 0x7f800000;
      auVar141._20_4_ = 0x7f800000;
      auVar141._24_4_ = 0x7f800000;
      auVar141._28_4_ = 0x7f800000;
      auVar250 = vblendvps_avx(auVar141,auVar37,auVar241);
      local_360 = auVar152._0_4_ * fVar214;
      fStack_35c = auVar152._4_4_ * fVar220;
      fStack_358 = auVar152._8_4_ * fVar259;
      fStack_354 = auVar152._12_4_ * fVar277;
      uStack_350 = 0;
      uStack_34c = 0;
      uStack_348 = 0;
      uStack_344 = auVar250._28_4_;
      auVar142._8_4_ = 0xff800000;
      auVar142._0_8_ = 0xff800000ff800000;
      auVar142._12_4_ = 0xff800000;
      auVar142._16_4_ = 0xff800000;
      auVar142._20_4_ = 0xff800000;
      auVar142._24_4_ = 0xff800000;
      auVar142._28_4_ = 0xff800000;
      auVar194 = vblendvps_avx(auVar142,auVar38,auVar241);
      auVar12 = auVar241 & auVar19;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar113 = vandps_avx(auVar19,auVar241);
        auVar19 = vcmpps_avx(auVar146,ZEXT832(0) << 0x20,2);
        auVar244 = ZEXT3264(auVar19);
        auVar149._8_4_ = 0xff800000;
        auVar149._0_8_ = 0xff800000ff800000;
        auVar149._12_4_ = 0xff800000;
        auVar149._16_4_ = 0xff800000;
        auVar149._20_4_ = 0xff800000;
        auVar149._24_4_ = 0xff800000;
        auVar149._28_4_ = 0xff800000;
        auVar231._8_4_ = 0x7f800000;
        auVar231._0_8_ = 0x7f8000007f800000;
        auVar231._12_4_ = 0x7f800000;
        auVar231._16_4_ = 0x7f800000;
        auVar231._20_4_ = 0x7f800000;
        auVar231._24_4_ = 0x7f800000;
        auVar231._28_4_ = 0x7f800000;
        auVar146 = vblendvps_avx(auVar231,auVar149,auVar19);
        auVar152 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
        auVar12 = vpmovsxwd_avx2(auVar152);
        auVar250 = vblendvps_avx(auVar250,auVar146,auVar12);
        auVar146 = vblendvps_avx(auVar149,auVar231,auVar19);
        auVar194 = vblendvps_avx(auVar194,auVar146,auVar12);
        auVar213._0_8_ = auVar113._0_8_ ^ 0xffffffffffffffff;
        auVar213._8_4_ = auVar113._8_4_ ^ 0xffffffff;
        auVar213._12_4_ = auVar113._12_4_ ^ 0xffffffff;
        auVar213._16_4_ = auVar113._16_4_ ^ 0xffffffff;
        auVar213._20_4_ = auVar113._20_4_ ^ 0xffffffff;
        auVar213._24_4_ = auVar113._24_4_ ^ 0xffffffff;
        auVar213._28_4_ = auVar113._28_4_ ^ 0xffffffff;
        auVar113 = vorps_avx(auVar19,auVar213);
        auVar113 = vandps_avx(auVar241,auVar113);
      }
    }
    auVar264 = ZEXT1664(auVar10);
    auVar146 = local_2e0 & auVar113;
    if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar146 >> 0x7f,0) != '\0') ||
          (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar146 >> 0xbf,0) != '\0') ||
        (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar146[0x1f] < '\0') {
      local_380 = ZEXT1632(auVar10);
      fVar267 = *(float *)(ray + k * 4 + 0x80);
      local_5b0 = ZEXT416((uint)fVar267);
      fVar268 = fVar267 - (float)local_8d0._0_4_;
      auVar211._4_4_ = fVar268;
      auVar211._0_4_ = fVar268;
      auVar211._8_4_ = fVar268;
      auVar211._12_4_ = fVar268;
      auVar211._16_4_ = fVar268;
      auVar211._20_4_ = fVar268;
      auVar211._24_4_ = fVar268;
      auVar211._28_4_ = fVar268;
      local_320 = vminps_avx(auVar211,auVar194);
      auVar40._4_4_ = fVar151 * fVar216;
      auVar40._0_4_ = fVar131 * fVar217;
      auVar40._8_4_ = fVar179 * fVar219;
      auVar40._12_4_ = fVar180 * fVar222;
      auVar40._16_4_ = fVar181 * fVar97;
      auVar40._20_4_ = fVar260 * fVar126;
      auVar40._24_4_ = fVar265 * fVar127;
      auVar40._28_4_ = fVar268;
      auVar10 = vfmadd213ps_fma(auVar255,local_9e0,auVar40);
      auVar78._4_4_ = fStack_2fc;
      auVar78._0_4_ = local_300;
      auVar78._8_4_ = fStack_2f8;
      auVar78._12_4_ = fStack_2f4;
      auVar78._16_4_ = fStack_2f0;
      auVar78._20_4_ = fStack_2ec;
      auVar78._24_4_ = fStack_2e8;
      auVar78._28_4_ = fStack_2e4;
      auVar19 = vmaxps_avx(auVar78,auVar250);
      auVar152 = vfmadd213ps_fma(auVar17,auVar263,ZEXT1632(auVar10));
      auVar41._4_4_ = (float)local_980._4_4_ * fVar151;
      auVar41._0_4_ = (float)local_980._0_4_ * fVar131;
      auVar41._8_4_ = fStack_978 * fVar179;
      auVar41._12_4_ = fStack_974 * fVar180;
      auVar41._16_4_ = fStack_970 * fVar181;
      auVar41._20_4_ = fStack_96c * fVar260;
      auVar41._24_4_ = fStack_968 * fVar265;
      auVar41._28_4_ = uVar96;
      auVar264 = ZEXT3264(_local_a60);
      auVar10 = vfmadd231ps_fma(auVar41,_local_a60,local_9e0);
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar10),_local_820,auVar263);
      auVar59._4_4_ = uStack_85c;
      auVar59._0_4_ = local_860;
      auVar59._8_4_ = uStack_858;
      auVar59._12_4_ = uStack_854;
      auVar59._16_4_ = uStack_850;
      auVar59._20_4_ = uStack_84c;
      auVar59._24_4_ = uStack_848;
      auVar59._28_4_ = uStack_844;
      auVar146 = vandps_avx(auVar59,ZEXT1632(auVar107));
      auVar143._8_4_ = 0x219392ef;
      auVar143._0_8_ = 0x219392ef219392ef;
      auVar143._12_4_ = 0x219392ef;
      auVar143._16_4_ = 0x219392ef;
      auVar143._20_4_ = 0x219392ef;
      auVar143._24_4_ = 0x219392ef;
      auVar143._28_4_ = 0x219392ef;
      auVar255 = vcmpps_avx(auVar146,auVar143,1);
      auVar146 = vrcpps_avx(ZEXT1632(auVar107));
      auVar170._8_4_ = 0x3f800000;
      auVar170._0_8_ = 0x3f8000003f800000;
      auVar170._12_4_ = 0x3f800000;
      auVar170._16_4_ = 0x3f800000;
      auVar170._20_4_ = 0x3f800000;
      auVar170._24_4_ = 0x3f800000;
      auVar170._28_4_ = 0x3f800000;
      auVar241 = ZEXT1632(auVar107);
      auVar10 = vfnmadd213ps_fma(auVar146,auVar241,auVar170);
      auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar146,auVar146);
      auVar288._0_4_ = auVar107._0_4_ ^ local_680;
      auVar288._4_4_ = auVar107._4_4_ ^ uStack_67c;
      auVar288._8_4_ = auVar107._8_4_ ^ uStack_678;
      auVar288._12_4_ = auVar107._12_4_ ^ uStack_674;
      auVar288._16_4_ = fStack_670;
      auVar288._20_4_ = fStack_66c;
      auVar288._24_4_ = fStack_668;
      auVar288._28_4_ = uStack_664;
      auVar42._4_4_ = auVar10._4_4_ * (float)(auVar152._4_4_ ^ uStack_67c);
      auVar42._0_4_ = auVar10._0_4_ * (float)(auVar152._0_4_ ^ local_680);
      auVar42._8_4_ = auVar10._8_4_ * (float)(auVar152._8_4_ ^ uStack_678);
      auVar42._12_4_ = auVar10._12_4_ * (float)(auVar152._12_4_ ^ uStack_674);
      auVar42._16_4_ = fStack_670 * 0.0;
      auVar42._20_4_ = fStack_66c * 0.0;
      auVar42._24_4_ = fStack_668 * 0.0;
      auVar42._28_4_ = uStack_664;
      auVar146 = vcmpps_avx(auVar241,auVar288,1);
      auVar146 = vorps_avx(auVar255,auVar146);
      auVar283._8_4_ = 0xff800000;
      auVar283._0_8_ = 0xff800000ff800000;
      auVar283._12_4_ = 0xff800000;
      auVar283._16_4_ = 0xff800000;
      auVar283._20_4_ = 0xff800000;
      auVar283._24_4_ = 0xff800000;
      auVar283._28_4_ = 0xff800000;
      auVar146 = vblendvps_avx(auVar42,auVar283,auVar146);
      auVar17 = vmaxps_avx(auVar19,auVar146);
      auVar146 = vcmpps_avx(auVar241,auVar288,6);
      auVar146 = vorps_avx(auVar255,auVar146);
      auVar289._8_4_ = 0x7f800000;
      auVar289._0_8_ = 0x7f8000007f800000;
      auVar289._12_4_ = 0x7f800000;
      auVar289._16_4_ = 0x7f800000;
      auVar289._20_4_ = 0x7f800000;
      auVar289._24_4_ = 0x7f800000;
      auVar289._28_4_ = 0x7f800000;
      auVar146 = vblendvps_avx(auVar42,auVar289,auVar146);
      auVar19 = vminps_avx(local_320,auVar146);
      local_a40._28_4_ = auVar21._28_4_;
      fVar217 = (float)(local_680 ^ (uint)auVar21._0_4_);
      fVar216 = (float)(uStack_67c ^ (uint)auVar21._4_4_);
      fVar219 = (float)(uStack_678 ^ (uint)auVar21._8_4_);
      fVar222 = (float)(uStack_674 ^ (uint)auVar21._12_4_);
      fVar97 = (float)((uint)fStack_670 ^ (uint)auVar21._16_4_);
      fVar126 = (float)((uint)fStack_66c ^ (uint)auVar21._20_4_);
      fVar127 = (float)((uint)fStack_668 ^ (uint)auVar21._24_4_);
      auVar242._0_4_ = local_680 ^ (uint)local_a20._0_4_;
      auVar242._4_4_ = uStack_67c ^ (uint)local_a20._4_4_;
      auVar242._8_4_ = uStack_678 ^ (uint)local_a20._8_4_;
      auVar242._12_4_ = uStack_674 ^ (uint)local_a20._12_4_;
      auVar242._16_4_ = (uint)fStack_670 ^ (uint)local_a20._16_4_;
      auVar242._20_4_ = (uint)fStack_66c ^ (uint)local_a20._20_4_;
      auVar242._24_4_ = (uint)fStack_668 ^ (uint)local_a20._24_4_;
      auVar242._28_4_ = uStack_664 ^ local_a20._28_4_;
      auVar255 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar146 = vsubps_avx(auVar255,auVar212);
      auVar255 = vsubps_avx(auVar255,local_7a0);
      auVar43._4_4_ = auVar255._4_4_ * fVar216;
      auVar43._0_4_ = auVar255._0_4_ * fVar217;
      auVar43._8_4_ = auVar255._8_4_ * fVar219;
      auVar43._12_4_ = auVar255._12_4_ * fVar222;
      auVar43._16_4_ = auVar255._16_4_ * fVar97;
      auVar43._20_4_ = auVar255._20_4_ * fVar126;
      auVar43._24_4_ = auVar255._24_4_ * fVar127;
      auVar43._28_4_ = auVar255._28_4_;
      auVar10 = vfmadd231ps_fma(auVar43,auVar242,auVar146);
      auVar251._0_4_ = local_680 ^ (uint)local_a00._0_4_;
      auVar251._4_4_ = uStack_67c ^ (uint)local_a00._4_4_;
      auVar251._8_4_ = uStack_678 ^ (uint)local_a00._8_4_;
      auVar251._12_4_ = uStack_674 ^ (uint)local_a00._12_4_;
      auVar251._16_4_ = (uint)fStack_670 ^ (uint)local_a00._16_4_;
      auVar251._20_4_ = (uint)fStack_66c ^ (uint)local_a00._20_4_;
      auVar251._24_4_ = (uint)fStack_668 ^ (uint)local_a00._24_4_;
      auVar251._28_4_ = uStack_664 ^ local_a00._28_4_;
      auVar146 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar20);
      auVar152 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar251,auVar146);
      auVar44._4_4_ = (float)local_980._4_4_ * fVar216;
      auVar44._0_4_ = (float)local_980._0_4_ * fVar217;
      auVar44._8_4_ = fStack_978 * fVar219;
      auVar44._12_4_ = fStack_974 * fVar222;
      auVar44._16_4_ = fStack_970 * fVar97;
      auVar44._20_4_ = fStack_96c * fVar126;
      auVar44._24_4_ = fStack_968 * fVar127;
      auVar44._28_4_ = uStack_664 ^ local_a40._28_4_;
      auVar10 = vfmadd231ps_fma(auVar44,_local_a60,auVar242);
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar10),_local_820,auVar251);
      auVar146 = vandps_avx(auVar59,ZEXT1632(auVar107));
      auVar20 = vrcpps_avx(ZEXT1632(auVar107));
      auVar197._8_4_ = 0x219392ef;
      auVar197._0_8_ = 0x219392ef219392ef;
      auVar197._12_4_ = 0x219392ef;
      auVar197._16_4_ = 0x219392ef;
      auVar197._20_4_ = 0x219392ef;
      auVar197._24_4_ = 0x219392ef;
      auVar197._28_4_ = 0x219392ef;
      auVar255 = vcmpps_avx(auVar146,auVar197,1);
      auVar244 = ZEXT3264(auVar255);
      auVar212 = ZEXT1632(auVar107);
      auVar10 = vfnmadd213ps_fma(auVar20,auVar212,auVar170);
      auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar20,auVar20);
      auVar252._0_4_ = auVar107._0_4_ ^ local_680;
      auVar252._4_4_ = auVar107._4_4_ ^ uStack_67c;
      auVar252._8_4_ = auVar107._8_4_ ^ uStack_678;
      auVar252._12_4_ = auVar107._12_4_ ^ uStack_674;
      auVar252._16_4_ = fStack_670;
      auVar252._20_4_ = fStack_66c;
      auVar252._24_4_ = fStack_668;
      auVar252._28_4_ = uStack_664;
      auVar45._4_4_ = auVar10._4_4_ * (float)(auVar152._4_4_ ^ uStack_67c);
      auVar45._0_4_ = auVar10._0_4_ * (float)(auVar152._0_4_ ^ local_680);
      auVar45._8_4_ = auVar10._8_4_ * (float)(auVar152._8_4_ ^ uStack_678);
      auVar45._12_4_ = auVar10._12_4_ * (float)(auVar152._12_4_ ^ uStack_674);
      auVar45._16_4_ = fStack_670 * 0.0;
      auVar45._20_4_ = fStack_66c * 0.0;
      auVar45._24_4_ = fStack_668 * 0.0;
      auVar45._28_4_ = uStack_664;
      auVar275 = ZEXT3264(auVar45);
      auVar146 = vcmpps_avx(auVar212,auVar252,1);
      auVar146 = vorps_avx(auVar146,auVar255);
      auVar116._8_4_ = 0xff800000;
      auVar116._0_8_ = 0xff800000ff800000;
      auVar116._12_4_ = 0xff800000;
      auVar116._16_4_ = 0xff800000;
      auVar116._20_4_ = 0xff800000;
      auVar116._24_4_ = 0xff800000;
      auVar116._28_4_ = 0xff800000;
      auVar146 = vblendvps_avx(auVar45,auVar116,auVar146);
      auVar286 = ZEXT3264(auVar146);
      _local_9a0 = vmaxps_avx(auVar17,auVar146);
      auVar146 = vcmpps_avx(auVar212,auVar252,6);
      auVar146 = vorps_avx(auVar255,auVar146);
      auVar117._8_4_ = 0x7f800000;
      auVar117._0_8_ = 0x7f8000007f800000;
      auVar117._12_4_ = 0x7f800000;
      auVar117._16_4_ = 0x7f800000;
      auVar117._20_4_ = 0x7f800000;
      auVar117._24_4_ = 0x7f800000;
      auVar117._28_4_ = 0x7f800000;
      auVar146 = vblendvps_avx(auVar45,auVar117,auVar146);
      auVar113 = vandps_avx(local_2e0,auVar113);
      local_3a0 = vminps_avx(auVar19,auVar146);
      auVar146 = vcmpps_avx(_local_9a0,local_3a0,2);
      auVar255 = auVar113 & auVar146;
      if ((((((((auVar255 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar255 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar255 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar255 >> 0x7f,0) != '\0') ||
            (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar255 >> 0xbf,0) != '\0') ||
          (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar255[0x1f] < '\0') {
        auVar77._4_4_ = fStack_33c;
        auVar77._0_4_ = local_340;
        auVar77._8_4_ = fStack_338;
        auVar77._12_4_ = fStack_334;
        auVar77._16_4_ = uStack_330;
        auVar77._20_4_ = uStack_32c;
        auVar77._24_4_ = uStack_328;
        auVar77._28_4_ = fStack_324;
        auVar255 = vminps_avx(auVar77,auVar170);
        auVar286 = ZEXT864(0) << 0x20;
        auVar255 = vmaxps_avx(auVar255,ZEXT832(0) << 0x20);
        auVar76._4_4_ = fStack_35c;
        auVar76._0_4_ = local_360;
        auVar76._8_4_ = fStack_358;
        auVar76._12_4_ = fStack_354;
        auVar76._16_4_ = uStack_350;
        auVar76._20_4_ = uStack_34c;
        auVar76._24_4_ = uStack_348;
        auVar76._28_4_ = uStack_344;
        auVar17 = vminps_avx(auVar76,auVar170);
        auVar17 = vmaxps_avx(auVar17,ZEXT832(0) << 0x20);
        fVar217 = DAT_01faff40._28_4_;
        auVar46._4_4_ = (auVar255._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar46._0_4_ = (auVar255._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar46._8_4_ = (auVar255._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar46._12_4_ = (auVar255._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar46._16_4_ = (auVar255._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar46._20_4_ = (auVar255._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar46._24_4_ = (auVar255._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar46._28_4_ = auVar255._28_4_ + fVar217;
        auVar10 = vfmadd213ps_fma(auVar46,local_7c0,local_940);
        auVar47._4_4_ = (auVar17._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar47._0_4_ = (auVar17._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar47._8_4_ = (auVar17._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar47._12_4_ = (auVar17._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar47._16_4_ = (auVar17._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar47._20_4_ = (auVar17._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar47._24_4_ = (auVar17._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar47._28_4_ = auVar17._28_4_ + fVar217;
        auVar152 = vfmadd213ps_fma(auVar47,local_7c0,local_940);
        auVar255 = vminps_avx(local_7e0,local_800);
        auVar17 = vminps_avx(auVar22,auVar23);
        auVar255 = vminps_avx(auVar255,auVar17);
        auVar7 = vsubps_avx(auVar255,auVar7);
        auVar113 = vandps_avx(auVar146,auVar113);
        local_1a0 = ZEXT1632(auVar10);
        local_1c0 = ZEXT1632(auVar152);
        auVar48._4_4_ = auVar7._4_4_ * 0.99999976;
        auVar48._0_4_ = auVar7._0_4_ * 0.99999976;
        auVar48._8_4_ = auVar7._8_4_ * 0.99999976;
        auVar48._12_4_ = auVar7._12_4_ * 0.99999976;
        auVar48._16_4_ = auVar7._16_4_ * 0.99999976;
        auVar48._20_4_ = auVar7._20_4_ * 0.99999976;
        auVar48._24_4_ = auVar7._24_4_ * 0.99999976;
        auVar48._28_4_ = auVar7._28_4_;
        auVar146 = vmaxps_avx(ZEXT832(0) << 0x20,auVar48);
        auVar49._4_4_ = auVar146._4_4_ * auVar146._4_4_;
        auVar49._0_4_ = auVar146._0_4_ * auVar146._0_4_;
        auVar49._8_4_ = auVar146._8_4_ * auVar146._8_4_;
        auVar49._12_4_ = auVar146._12_4_ * auVar146._12_4_;
        auVar49._16_4_ = auVar146._16_4_ * auVar146._16_4_;
        auVar49._20_4_ = auVar146._20_4_ * auVar146._20_4_;
        auVar49._24_4_ = auVar146._24_4_ * auVar146._24_4_;
        auVar49._28_4_ = auVar146._28_4_;
        auVar7 = vsubps_avx(auVar13,auVar49);
        auVar50._4_4_ = auVar7._4_4_ * fVar218 * 4.0;
        auVar50._0_4_ = auVar7._0_4_ * fVar215 * 4.0;
        auVar50._8_4_ = auVar7._8_4_ * fVar221 * 4.0;
        auVar50._12_4_ = auVar7._12_4_ * fVar128 * 4.0;
        auVar50._16_4_ = auVar7._16_4_ * fVar129 * 4.0;
        auVar50._20_4_ = auVar7._20_4_ * fVar130 * 4.0;
        auVar50._24_4_ = auVar7._24_4_ * fVar266 * 4.0;
        auVar50._28_4_ = auVar146._28_4_;
        auVar13 = vsubps_avx(auVar249,auVar50);
        auVar275 = ZEXT3264(auVar13);
        auVar146 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar146 >> 0x7f,0) == '\0') &&
              (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar146 >> 0xbf,0) == '\0') &&
            (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar146[0x1f]) {
          auVar118 = SUB6432(ZEXT864(0),0) << 0x20;
          local_8a0 = ZEXT832(0) << 0x20;
          _local_6a0 = ZEXT832(0) << 0x20;
          auVar255 = ZEXT832(0) << 0x40;
          auVar177 = ZEXT864(0) << 0x20;
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar253._8_4_ = 0xff800000;
          auVar253._0_8_ = 0xff800000ff800000;
          auVar253._12_4_ = 0xff800000;
          auVar253._16_4_ = 0xff800000;
          auVar253._20_4_ = 0xff800000;
          auVar253._24_4_ = 0xff800000;
          auVar253._28_4_ = 0xff800000;
          local_880 = local_8a0;
        }
        else {
          auVar17 = vsqrtps_avx(auVar13);
          auVar254._0_4_ = fVar215 + fVar215;
          auVar254._4_4_ = fVar218 + fVar218;
          auVar254._8_4_ = fVar221 + fVar221;
          auVar254._12_4_ = fVar128 + fVar128;
          auVar254._16_4_ = fVar129 + fVar129;
          auVar254._20_4_ = fVar130 + fVar130;
          auVar254._24_4_ = fVar266 + fVar266;
          auVar254._28_4_ = fVar200 + fVar200;
          auVar255 = vrcpps_avx(auVar254);
          auVar10 = vfnmadd213ps_fma(auVar254,auVar255,auVar170);
          auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar255,auVar255);
          auVar284._0_4_ = (uint)local_2c0._0_4_ ^ local_680;
          auVar284._4_4_ = (uint)local_2c0._4_4_ ^ uStack_67c;
          auVar284._8_4_ = (uint)local_2c0._8_4_ ^ uStack_678;
          auVar284._12_4_ = (uint)local_2c0._12_4_ ^ uStack_674;
          auVar284._16_4_ = (uint)local_2c0._16_4_ ^ (uint)fStack_670;
          auVar284._20_4_ = (uint)local_2c0._20_4_ ^ (uint)fStack_66c;
          auVar284._24_4_ = (uint)local_2c0._24_4_ ^ (uint)fStack_668;
          auVar284._28_4_ = (uint)local_2c0._28_4_ ^ uStack_664;
          auVar255 = vsubps_avx(auVar284,auVar17);
          auVar19 = vsubps_avx(auVar17,local_2c0);
          fVar200 = auVar255._0_4_ * auVar10._0_4_;
          fVar216 = auVar255._4_4_ * auVar10._4_4_;
          auVar51._4_4_ = fVar216;
          auVar51._0_4_ = fVar200;
          fVar215 = auVar255._8_4_ * auVar10._8_4_;
          auVar51._8_4_ = fVar215;
          fVar219 = auVar255._12_4_ * auVar10._12_4_;
          auVar51._12_4_ = fVar219;
          fVar218 = auVar255._16_4_ * 0.0;
          auVar51._16_4_ = fVar218;
          fVar222 = auVar255._20_4_ * 0.0;
          auVar51._20_4_ = fVar222;
          fVar221 = auVar255._24_4_ * 0.0;
          auVar51._24_4_ = fVar221;
          auVar51._28_4_ = auVar17._28_4_;
          fVar97 = auVar10._0_4_ * auVar19._0_4_;
          fVar126 = auVar10._4_4_ * auVar19._4_4_;
          auVar52._4_4_ = fVar126;
          auVar52._0_4_ = fVar97;
          fVar127 = auVar10._8_4_ * auVar19._8_4_;
          auVar52._8_4_ = fVar127;
          fVar128 = auVar10._12_4_ * auVar19._12_4_;
          auVar52._12_4_ = fVar128;
          fVar129 = auVar19._16_4_ * 0.0;
          auVar52._16_4_ = fVar129;
          fVar130 = auVar19._20_4_ * 0.0;
          auVar52._20_4_ = fVar130;
          fVar131 = auVar19._24_4_ * 0.0;
          auVar52._24_4_ = fVar131;
          auVar52._28_4_ = auVar255._28_4_;
          auVar286 = ZEXT3264(auVar52);
          auVar10 = vfmadd213ps_fma(auVar280,auVar51,auVar298);
          auVar152 = vfmadd213ps_fma(auVar280,auVar52,auVar298);
          auVar255 = ZEXT1632(CONCAT412(auVar10._12_4_ * fVar277,
                                        CONCAT48(auVar10._8_4_ * fVar259,
                                                 CONCAT44(auVar10._4_4_ * fVar220,
                                                          auVar10._0_4_ * fVar214))));
          auVar53._28_4_ = local_a60._28_4_;
          auVar53._0_28_ =
               ZEXT1628(CONCAT412(auVar152._12_4_ * fVar277,
                                  CONCAT48(auVar152._8_4_ * fVar259,
                                           CONCAT44(auVar152._4_4_ * fVar220,
                                                    auVar152._0_4_ * fVar214))));
          auVar10 = vfmadd213ps_fma(auVar15,auVar255,auVar114);
          auVar152 = vfmadd213ps_fma(auVar15,auVar53,auVar114);
          auVar107 = vfmadd213ps_fma(auVar16,auVar255,local_960);
          auVar102 = vfmadd213ps_fma(auVar16,auVar53,local_960);
          auVar133 = vfmadd213ps_fma(auVar255,auVar118,auVar169);
          auVar164 = vfmadd213ps_fma(auVar118,auVar53,auVar169);
          auVar54._4_4_ = (float)local_820._4_4_ * fVar216;
          auVar54._0_4_ = (float)local_820._0_4_ * fVar200;
          auVar54._8_4_ = fStack_818 * fVar215;
          auVar54._12_4_ = fStack_814 * fVar219;
          auVar54._16_4_ = fStack_810 * fVar218;
          auVar54._20_4_ = fStack_80c * fVar222;
          auVar54._24_4_ = fStack_808 * fVar221;
          auVar54._28_4_ = 0;
          auVar118 = vsubps_avx(auVar54,ZEXT1632(auVar10));
          auVar84._4_4_ = (float)local_a60._4_4_ * fVar216;
          auVar84._0_4_ = (float)local_a60._0_4_ * fVar200;
          auVar84._8_4_ = fStack_a58 * fVar215;
          auVar84._12_4_ = fStack_a54 * fVar219;
          auVar84._16_4_ = fStack_a50 * fVar218;
          auVar84._20_4_ = fStack_a4c * fVar222;
          auVar84._24_4_ = fStack_a48 * fVar221;
          auVar84._28_4_ = fVar217;
          auVar255 = vsubps_avx(auVar84,ZEXT1632(auVar107));
          auVar171._0_4_ = (float)local_980._0_4_ * fVar200;
          auVar171._4_4_ = (float)local_980._4_4_ * fVar216;
          auVar171._8_4_ = fStack_978 * fVar215;
          auVar171._12_4_ = fStack_974 * fVar219;
          auVar171._16_4_ = fStack_970 * fVar218;
          auVar171._20_4_ = fStack_96c * fVar222;
          auVar171._24_4_ = fStack_968 * fVar221;
          auVar171._28_4_ = 0;
          auVar15 = vsubps_avx(auVar171,ZEXT1632(auVar133));
          auVar177 = ZEXT3264(auVar15);
          auVar256._0_4_ = (float)local_820._0_4_ * fVar97;
          auVar256._4_4_ = (float)local_820._4_4_ * fVar126;
          auVar256._8_4_ = fStack_818 * fVar127;
          auVar256._12_4_ = fStack_814 * fVar128;
          auVar256._16_4_ = fStack_810 * fVar129;
          auVar256._20_4_ = fStack_80c * fVar130;
          auVar256._24_4_ = fStack_808 * fVar131;
          auVar256._28_4_ = 0;
          local_880 = vsubps_avx(auVar256,ZEXT1632(auVar152));
          auVar55._4_4_ = (float)local_a60._4_4_ * fVar126;
          auVar55._0_4_ = (float)local_a60._0_4_ * fVar97;
          auVar55._8_4_ = fStack_a58 * fVar127;
          auVar55._12_4_ = fStack_a54 * fVar128;
          auVar55._16_4_ = fStack_a50 * fVar129;
          auVar55._20_4_ = fStack_a4c * fVar130;
          auVar55._24_4_ = fStack_a48 * fVar131;
          auVar55._28_4_ = local_880._28_4_;
          local_8a0 = vsubps_avx(auVar55,ZEXT1632(auVar102));
          auVar56._4_4_ = (float)local_980._4_4_ * fVar126;
          auVar56._0_4_ = (float)local_980._0_4_ * fVar97;
          auVar56._8_4_ = fStack_978 * fVar127;
          auVar56._12_4_ = fStack_974 * fVar128;
          auVar56._16_4_ = fStack_970 * fVar129;
          auVar56._20_4_ = fStack_96c * fVar130;
          auVar56._24_4_ = fStack_968 * fVar131;
          auVar56._28_4_ = local_8a0._28_4_;
          _local_6a0 = vsubps_avx(auVar56,ZEXT1632(auVar164));
          auVar281 = ZEXT864(0) << 0x20;
          auVar15 = vcmpps_avx(auVar13,_DAT_01faff00,5);
          auVar257._8_4_ = 0x7f800000;
          auVar257._0_8_ = 0x7f8000007f800000;
          auVar257._12_4_ = 0x7f800000;
          auVar257._16_4_ = 0x7f800000;
          auVar257._20_4_ = 0x7f800000;
          auVar257._24_4_ = 0x7f800000;
          auVar257._28_4_ = 0x7f800000;
          auVar243 = vblendvps_avx(auVar257,auVar51,auVar15);
          auVar60._4_4_ = uStack_85c;
          auVar60._0_4_ = local_860;
          auVar60._8_4_ = uStack_858;
          auVar60._12_4_ = uStack_854;
          auVar60._16_4_ = uStack_850;
          auVar60._20_4_ = uStack_84c;
          auVar60._24_4_ = uStack_848;
          auVar60._28_4_ = uStack_844;
          auVar13 = vandps_avx(auVar60,local_2a0);
          auVar13 = vmaxps_avx(local_580,auVar13);
          auVar57._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar57._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar57._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar57._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar57._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar57._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar57._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar57._28_4_ = auVar13._28_4_;
          auVar13 = vandps_avx(auVar60,auVar18);
          auVar13 = vcmpps_avx(auVar13,auVar57,1);
          auVar275 = ZEXT3264(auVar13);
          auVar258._8_4_ = 0xff800000;
          auVar258._0_8_ = 0xff800000ff800000;
          auVar258._12_4_ = 0xff800000;
          auVar258._16_4_ = 0xff800000;
          auVar258._20_4_ = 0xff800000;
          auVar258._24_4_ = 0xff800000;
          auVar258._28_4_ = 0xff800000;
          auVar253 = vblendvps_avx(auVar258,auVar52,auVar15);
          auVar17 = auVar15 & auVar13;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0x7f,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0x1f] < '\0') {
            auVar146 = vandps_avx(auVar13,auVar15);
            auVar13 = vcmpps_avx(auVar7,ZEXT832(0) << 0x20,2);
            auVar285._8_4_ = 0xff800000;
            auVar285._0_8_ = 0xff800000ff800000;
            auVar285._12_4_ = 0xff800000;
            auVar285._16_4_ = 0xff800000;
            auVar285._20_4_ = 0xff800000;
            auVar285._24_4_ = 0xff800000;
            auVar285._28_4_ = 0xff800000;
            auVar286 = ZEXT3264(auVar285);
            auVar290._8_4_ = 0x7f800000;
            auVar290._0_8_ = 0x7f8000007f800000;
            auVar290._12_4_ = 0x7f800000;
            auVar290._16_4_ = 0x7f800000;
            auVar290._20_4_ = 0x7f800000;
            auVar290._24_4_ = 0x7f800000;
            auVar290._28_4_ = 0x7f800000;
            auVar7 = vblendvps_avx(auVar290,auVar285,auVar13);
            auVar10 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
            auVar17 = vpmovsxwd_avx2(auVar10);
            auVar275 = ZEXT3264(auVar17);
            auVar243 = vblendvps_avx(auVar243,auVar7,auVar17);
            auVar7 = vblendvps_avx(auVar285,auVar290,auVar13);
            auVar281 = ZEXT3264(auVar7);
            auVar253 = vblendvps_avx(auVar253,auVar7,auVar17);
            auVar232._0_8_ = auVar146._0_8_ ^ 0xffffffffffffffff;
            auVar232._8_4_ = auVar146._8_4_ ^ 0xffffffff;
            auVar232._12_4_ = auVar146._12_4_ ^ 0xffffffff;
            auVar232._16_4_ = auVar146._16_4_ ^ 0xffffffff;
            auVar232._20_4_ = auVar146._20_4_ ^ 0xffffffff;
            auVar232._24_4_ = auVar146._24_4_ ^ 0xffffffff;
            auVar232._28_4_ = auVar146._28_4_ ^ 0xffffffff;
            auVar146 = vorps_avx(auVar13,auVar232);
            auVar146 = vandps_avx(auVar15,auVar146);
          }
        }
        auVar264 = ZEXT3264(_local_9a0);
        local_400 = _local_9a0;
        local_3e0 = vminps_avx(local_3a0,auVar243);
        local_a40 = vmaxps_avx(_local_9a0,auVar253);
        auVar244 = ZEXT3264(local_a40);
        local_3c0 = local_a40;
        auVar7 = vcmpps_avx(_local_9a0,local_3e0,2);
        local_600 = vandps_avx(auVar7,auVar113);
        auVar7 = vcmpps_avx(local_a40,local_3a0,2);
        local_660 = vandps_avx(auVar7,auVar113);
        auVar113 = vorps_avx(local_660,local_600);
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0x7f,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar113 >> 0xbf,0) != '\0') ||
            (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar113[0x1f] < '\0') {
          local_620._0_8_ = auVar146._0_8_ ^ 0xffffffffffffffff;
          local_620._8_4_ = auVar146._8_4_ ^ 0xffffffff;
          local_620._12_4_ = auVar146._12_4_ ^ 0xffffffff;
          local_620._16_4_ = auVar146._16_4_ ^ 0xffffffff;
          local_620._20_4_ = auVar146._20_4_ ^ 0xffffffff;
          local_620._24_4_ = auVar146._24_4_ ^ 0xffffffff;
          local_620._28_4_ = auVar146._28_4_ ^ 0xffffffff;
          auVar178._0_4_ = (float)local_980._0_4_ * auVar177._0_4_;
          auVar178._4_4_ = (float)local_980._4_4_ * auVar177._4_4_;
          auVar178._8_4_ = fStack_978 * auVar177._8_4_;
          auVar178._12_4_ = fStack_974 * auVar177._12_4_;
          auVar178._16_4_ = fStack_970 * auVar177._16_4_;
          auVar178._20_4_ = fStack_96c * auVar177._20_4_;
          auVar178._28_36_ = auVar177._28_36_;
          auVar178._24_4_ = fStack_968 * auVar177._24_4_;
          auVar10 = vfmadd213ps_fma(auVar255,_local_a60,auVar178._0_32_);
          auVar10 = vfmadd213ps_fma(auVar118,_local_820,ZEXT1632(auVar10));
          auVar61._4_4_ = uStack_85c;
          auVar61._0_4_ = local_860;
          auVar61._8_4_ = uStack_858;
          auVar61._12_4_ = uStack_854;
          auVar61._16_4_ = uStack_850;
          auVar61._20_4_ = uStack_84c;
          auVar61._24_4_ = uStack_848;
          auVar61._28_4_ = uStack_844;
          auVar113 = vandps_avx(ZEXT1632(auVar10),auVar61);
          auVar144._8_4_ = 0x3e99999a;
          auVar144._0_8_ = 0x3e99999a3e99999a;
          auVar144._12_4_ = 0x3e99999a;
          auVar144._16_4_ = 0x3e99999a;
          auVar144._20_4_ = 0x3e99999a;
          auVar144._24_4_ = 0x3e99999a;
          auVar144._28_4_ = 0x3e99999a;
          auVar113 = vcmpps_avx(auVar113,auVar144,1);
          auVar113 = vorps_avx(auVar113,local_620);
          auVar145._8_4_ = 3;
          auVar145._0_8_ = 0x300000003;
          auVar145._12_4_ = 3;
          auVar145._16_4_ = 3;
          auVar145._20_4_ = 3;
          auVar145._24_4_ = 3;
          auVar145._28_4_ = 3;
          auVar172._8_4_ = 2;
          auVar172._0_8_ = 0x200000002;
          auVar172._12_4_ = 2;
          auVar172._16_4_ = 2;
          auVar172._20_4_ = 2;
          auVar172._24_4_ = 2;
          auVar172._28_4_ = 2;
          auVar113 = vblendvps_avx(auVar172,auVar145,auVar113);
          local_640._4_4_ = local_c08;
          local_640._0_4_ = local_c08;
          local_640._8_4_ = local_c08;
          local_640._12_4_ = local_c08;
          local_640._16_4_ = local_c08;
          local_640._20_4_ = local_c08;
          local_640._24_4_ = local_c08;
          local_640._28_4_ = local_c08;
          local_6c0 = vpcmpgtd_avx2(auVar113,local_640);
          local_5e0 = vpandn_avx2(local_6c0,local_600);
          auVar177 = ZEXT3264(local_5e0);
          auVar113 = local_600 & ~local_6c0;
          fStack_b3c = auVar9._4_4_;
          fStack_b38 = auVar9._8_4_;
          fStack_b34 = auVar9._12_4_;
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0x7f,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0xbf,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar113[0x1f]) {
            auVar119._4_4_ = fVar267;
            auVar119._0_4_ = fVar267;
            auVar119._8_4_ = fVar267;
            auVar119._12_4_ = fVar267;
            auVar119._16_4_ = fVar267;
            auVar119._20_4_ = fVar267;
            auVar119._24_4_ = fVar267;
            auVar119._28_4_ = fVar267;
            auVar113 = local_660;
            fVar200 = (float)local_980._0_4_;
            fVar217 = (float)local_980._4_4_;
            fVar216 = fStack_978;
            fVar215 = fStack_974;
            fVar259 = fStack_970;
            fVar219 = fStack_96c;
            fVar218 = fStack_968;
            local_a40 = auVar21;
            local_660 = auVar16;
            local_800._16_16_ = auVar236;
          }
          else {
            auVar152 = vminps_avx(auVar11,auVar100);
            auVar10 = vmaxps_avx(auVar11,auVar100);
            auVar107 = vminps_avx(auVar8,auVar9);
            auVar102 = vminps_avx(auVar152,auVar107);
            auVar152 = vmaxps_avx(auVar8,auVar9);
            auVar107 = vmaxps_avx(auVar10,auVar152);
            auVar10 = vandps_avx(auVar102,auVar237);
            auVar152 = vandps_avx(auVar107,auVar237);
            auVar10 = vmaxps_avx(auVar10,auVar152);
            auVar152 = vmovshdup_avx(auVar10);
            auVar152 = vmaxss_avx(auVar152,auVar10);
            auVar10 = vshufpd_avx(auVar10,auVar10,1);
            auVar10 = vmaxss_avx(auVar10,auVar152);
            local_960 = ZEXT1632(CONCAT124(auVar99._4_12_,auVar10._0_4_ * 1.9073486e-06));
            auVar10 = vshufps_avx(auVar107,auVar107,0xff);
            local_840._4_4_ = (float)local_9a0._4_4_ + (float)local_920._4_4_;
            local_840._0_4_ = (float)local_9a0._0_4_ + (float)local_920._0_4_;
            fStack_838 = fStack_998 + fStack_918;
            fStack_834 = fStack_994 + fStack_914;
            fStack_830 = fStack_990 + fStack_910;
            fStack_82c = fStack_98c + fStack_90c;
            fStack_828 = fStack_988 + fStack_908;
            fStack_824 = fStack_984 + fStack_904;
            do {
              auVar120._8_4_ = 0x7f800000;
              auVar120._0_8_ = 0x7f8000007f800000;
              auVar120._12_4_ = 0x7f800000;
              auVar120._16_4_ = 0x7f800000;
              auVar120._20_4_ = 0x7f800000;
              auVar120._24_4_ = 0x7f800000;
              auVar120._28_4_ = 0x7f800000;
              auVar113 = auVar177._0_32_;
              auVar146 = vblendvps_avx(auVar120,_local_9a0,auVar113);
              auVar7 = vshufps_avx(auVar146,auVar146,0xb1);
              auVar7 = vminps_avx(auVar146,auVar7);
              auVar13 = vshufpd_avx(auVar7,auVar7,5);
              auVar7 = vminps_avx(auVar7,auVar13);
              auVar13 = vpermpd_avx2(auVar7,0x4e);
              auVar7 = vminps_avx(auVar7,auVar13);
              auVar146 = vcmpps_avx(auVar146,auVar7,0);
              auVar7 = auVar113 & auVar146;
              if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar7 >> 0x7f,0) != '\0') ||
                    (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar7 >> 0xbf,0) != '\0') ||
                  (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar7[0x1f] < '\0') {
                auVar113 = vandps_avx(auVar146,auVar113);
              }
              uVar87 = vmovmskps_avx(auVar113);
              iVar24 = 0;
              for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar88 = iVar24 << 2;
              *(undefined4 *)(local_5e0 + uVar88) = 0;
              uVar87 = *(uint *)(local_1a0 + uVar88);
              uVar88 = *(uint *)(local_400 + uVar88);
              fVar200 = auVar5._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar200 = sqrtf((float)local_9c0._0_4_);
              }
              local_a00._0_4_ = fVar200 * 1.9073486e-06;
              auVar99 = vinsertps_avx(ZEXT416(uVar88),ZEXT416(uVar87),0x10);
              auVar264 = ZEXT1664(auVar99);
              bVar93 = true;
              uVar91 = 0;
              do {
                auVar164 = auVar264._0_16_;
                auVar152 = vmovshdup_avx(auVar164);
                fVar214 = auVar152._0_4_;
                fVar215 = 1.0 - fVar214;
                fVar220 = fVar215 * fVar215 * fVar215;
                fVar216 = fVar214 * fVar214;
                fVar217 = fVar214 * fVar216;
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                           ZEXT416((uint)fVar217));
                fVar200 = fVar214 * fVar215;
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * fVar200 * 6.0)),
                                           ZEXT416((uint)(fVar215 * fVar200)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar133 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar200 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar214 * fVar200)));
                auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                          ZEXT416((uint)fVar220));
                fVar214 = (auVar99._0_4_ + auVar133._0_4_) * 0.16666667;
                fVar217 = fVar217 * 0.16666667;
                auVar134._0_4_ = fVar217 * fVar125;
                auVar134._4_4_ = fVar217 * fStack_b3c;
                auVar134._8_4_ = fVar217 * fStack_b38;
                auVar134._12_4_ = fVar217 * fStack_b34;
                auVar182._4_4_ = fVar214;
                auVar182._0_4_ = fVar214;
                auVar182._8_4_ = fVar214;
                auVar182._12_4_ = fVar214;
                auVar99 = vfmadd132ps_fma(auVar182,auVar134,auVar8);
                fVar214 = (auVar107._0_4_ + auVar102._0_4_) * 0.16666667;
                auVar135._4_4_ = fVar214;
                auVar135._0_4_ = fVar214;
                auVar135._8_4_ = fVar214;
                auVar135._12_4_ = fVar214;
                auVar99 = vfmadd132ps_fma(auVar135,auVar99,auVar100);
                fVar217 = auVar264._0_4_;
                auVar153._4_4_ = fVar217;
                auVar153._0_4_ = fVar217;
                auVar153._8_4_ = fVar217;
                auVar153._12_4_ = fVar217;
                auVar107 = vfmadd213ps_fma(auVar153,local_9b0,_DAT_01f7aa10);
                fVar220 = fVar220 * 0.16666667;
                auVar101._4_4_ = fVar220;
                auVar101._0_4_ = fVar220;
                auVar101._8_4_ = fVar220;
                auVar101._12_4_ = fVar220;
                auVar99 = vfmadd132ps_fma(auVar101,auVar99,auVar11);
                local_7a0._0_16_ = auVar99;
                auVar107 = vsubps_avx(auVar107,auVar99);
                auVar99 = vdpps_avx(auVar107,auVar107,0x7f);
                fVar214 = auVar99._0_4_;
                if (fVar214 < 0.0) {
                  local_9e0._0_4_ = fVar216;
                  auVar244._0_4_ = sqrtf(fVar214);
                  auVar244._4_60_ = extraout_var;
                  auVar102 = auVar244._0_16_;
                  fVar216 = (float)local_9e0._0_4_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar99,auVar99);
                }
                auVar132 = ZEXT416((uint)fVar215);
                auVar103._4_4_ = fVar215;
                auVar103._0_4_ = fVar215;
                auVar103._8_4_ = fVar215;
                auVar103._12_4_ = fVar215;
                auVar201 = vfnmsub213ss_fma(auVar152,auVar152,ZEXT416((uint)(fVar200 * 4.0)));
                auVar133 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * 4.0)),auVar132,auVar132);
                fVar200 = fVar215 * -fVar215 * 0.5;
                fVar220 = auVar201._0_4_ * 0.5;
                fVar215 = auVar133._0_4_ * 0.5;
                fVar216 = fVar216 * 0.5;
                auVar227._0_4_ = fVar125 * fVar216;
                auVar227._4_4_ = fStack_b3c * fVar216;
                auVar227._8_4_ = fStack_b38 * fVar216;
                auVar227._12_4_ = fStack_b34 * fVar216;
                auVar183._4_4_ = fVar215;
                auVar183._0_4_ = fVar215;
                auVar183._8_4_ = fVar215;
                auVar183._12_4_ = fVar215;
                auVar133 = vfmadd213ps_fma(auVar183,auVar8,auVar227);
                auVar202._4_4_ = fVar220;
                auVar202._0_4_ = fVar220;
                auVar202._8_4_ = fVar220;
                auVar202._12_4_ = fVar220;
                auVar133 = vfmadd213ps_fma(auVar202,auVar100,auVar133);
                auVar273._4_4_ = fVar200;
                auVar273._0_4_ = fVar200;
                auVar273._8_4_ = fVar200;
                auVar273._12_4_ = fVar200;
                auVar98 = vfmadd213ps_fma(auVar273,auVar11,auVar133);
                auVar133 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar132,auVar152);
                auVar201 = vfmadd213ss_fma(auVar152,SUB6416(ZEXT464(0xc0000000),0),auVar132);
                auVar152 = vshufps_avx(auVar164,auVar164,0x55);
                auVar184._0_4_ = fVar125 * auVar152._0_4_;
                auVar184._4_4_ = fStack_b3c * auVar152._4_4_;
                auVar184._8_4_ = fStack_b38 * auVar152._8_4_;
                auVar184._12_4_ = fStack_b34 * auVar152._12_4_;
                uVar96 = auVar201._0_4_;
                auVar203._4_4_ = uVar96;
                auVar203._0_4_ = uVar96;
                auVar203._8_4_ = uVar96;
                auVar203._12_4_ = uVar96;
                auVar152 = vfmadd213ps_fma(auVar203,auVar8,auVar184);
                auVar154._0_4_ = auVar133._0_4_;
                auVar154._4_4_ = auVar154._0_4_;
                auVar154._8_4_ = auVar154._0_4_;
                auVar154._12_4_ = auVar154._0_4_;
                auVar152 = vfmadd213ps_fma(auVar154,auVar100,auVar152);
                auVar132 = vfmadd231ps_fma(auVar152,auVar11,auVar103);
                auVar133 = vdpps_avx(auVar98,auVar98,0x7f);
                auVar152 = vblendps_avx(auVar133,_DAT_01f7aa10,0xe);
                auVar201 = vrsqrtss_avx(auVar152,auVar152);
                fVar200 = auVar201._0_4_;
                fVar216 = auVar133._0_4_;
                fVar200 = fVar200 * 1.5 + fVar216 * -0.5 * fVar200 * fVar200 * fVar200;
                auVar201 = vdpps_avx(auVar98,auVar132,0x7f);
                auVar155._0_4_ = auVar132._0_4_ * fVar216;
                auVar155._4_4_ = auVar132._4_4_ * fVar216;
                auVar155._8_4_ = auVar132._8_4_ * fVar216;
                auVar155._12_4_ = auVar132._12_4_ * fVar216;
                fVar220 = auVar201._0_4_;
                auVar228._0_4_ = auVar98._0_4_ * fVar220;
                auVar228._4_4_ = auVar98._4_4_ * fVar220;
                fVar215 = auVar98._8_4_;
                auVar228._8_4_ = fVar215 * fVar220;
                fVar259 = auVar98._12_4_;
                auVar228._12_4_ = fVar259 * fVar220;
                auVar201 = vsubps_avx(auVar155,auVar228);
                auVar152 = vrcpss_avx(auVar152,auVar152);
                auVar132 = vfnmadd213ss_fma(auVar152,auVar133,ZEXT416(0x40000000));
                fVar220 = auVar152._0_4_ * auVar132._0_4_;
                auVar152 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar217 * (float)local_a00._0_4_)));
                auVar286 = ZEXT1664(auVar152);
                auVar247._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = -fVar215;
                auVar247._12_4_ = -fVar259;
                auVar185._0_4_ = fVar200 * auVar201._0_4_ * fVar220;
                auVar185._4_4_ = fVar200 * auVar201._4_4_ * fVar220;
                auVar185._8_4_ = fVar200 * auVar201._8_4_ * fVar220;
                auVar185._12_4_ = fVar200 * auVar201._12_4_ * fVar220;
                auVar239._0_4_ = auVar98._0_4_ * fVar200;
                auVar239._4_4_ = auVar98._4_4_ * fVar200;
                auVar239._8_4_ = fVar215 * fVar200;
                auVar239._12_4_ = fVar259 * fVar200;
                if (fVar216 < -fVar216) {
                  local_9e0._0_4_ = auVar102._0_4_;
                  local_a20._0_16_ = auVar239;
                  local_940._0_16_ = auVar185;
                  fVar200 = sqrtf(fVar216);
                  auVar286 = ZEXT464(auVar152._0_4_);
                  auVar102 = ZEXT416((uint)local_9e0._0_4_);
                  auVar185 = local_940._0_16_;
                  auVar239 = local_a20._0_16_;
                }
                else {
                  auVar133 = vsqrtss_avx(auVar133,auVar133);
                  fVar200 = auVar133._0_4_;
                }
                auVar133 = vdpps_avx(auVar107,auVar239,0x7f);
                auVar156 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar102,auVar286._0_16_);
                auVar201 = vdpps_avx(auVar247,auVar239,0x7f);
                auVar132 = vdpps_avx(auVar107,auVar185,0x7f);
                local_9e0._0_16_ = vdpps_avx(local_9b0,auVar239,0x7f);
                auVar156 = vfmadd213ss_fma(ZEXT416((uint)(auVar102._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_960._0_4_ / fVar200)),
                                           auVar156);
                auVar281 = ZEXT1664(auVar156);
                fVar200 = auVar201._0_4_ + auVar132._0_4_;
                auVar104._0_4_ = auVar133._0_4_ * auVar133._0_4_;
                auVar104._4_4_ = auVar133._4_4_ * auVar133._4_4_;
                auVar104._8_4_ = auVar133._8_4_ * auVar133._8_4_;
                auVar104._12_4_ = auVar133._12_4_ * auVar133._12_4_;
                auVar102 = vdpps_avx(auVar107,auVar247,0x7f);
                auVar132 = vsubps_avx(auVar99,auVar104);
                auVar201 = vrsqrtss_avx(auVar132,auVar132);
                fVar220 = auVar132._0_4_;
                fVar217 = auVar201._0_4_;
                fVar217 = fVar217 * 1.5 + fVar220 * -0.5 * fVar217 * fVar217 * fVar217;
                auVar201 = vdpps_avx(auVar107,local_9b0,0x7f);
                auVar102 = vfnmadd231ss_fma(auVar102,auVar133,ZEXT416((uint)fVar200));
                auVar201 = vfnmadd231ss_fma(auVar201,auVar133,local_9e0._0_16_);
                if (fVar220 < 0.0) {
                  local_a20._0_16_ = auVar133;
                  local_940._0_4_ = auVar156._0_4_;
                  local_7c0._0_16_ = ZEXT416((uint)fVar200);
                  local_7e0._0_4_ = fVar217;
                  local_800._0_16_ = auVar201;
                  fVar220 = sqrtf(fVar220);
                  auVar281 = ZEXT464((uint)local_940._0_4_);
                  auVar286 = ZEXT464(auVar152._0_4_);
                  fVar217 = (float)local_7e0._0_4_;
                  auVar201 = local_800._0_16_;
                  auVar133 = local_a20._0_16_;
                  auVar152 = local_7c0._0_16_;
                }
                else {
                  auVar152 = vsqrtss_avx(auVar132,auVar132);
                  fVar220 = auVar152._0_4_;
                  auVar152 = ZEXT416((uint)fVar200);
                }
                auVar275 = ZEXT1664(auVar98);
                auVar132 = vpermilps_avx(local_7a0._0_16_,0xff);
                fVar220 = fVar220 - auVar132._0_4_;
                auVar132 = vshufps_avx(auVar98,auVar98,0xff);
                auVar102 = vfmsub213ss_fma(auVar102,ZEXT416((uint)fVar217),auVar132);
                auVar186._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
                auVar186._8_4_ = local_9e0._8_4_ ^ 0x80000000;
                auVar186._12_4_ = local_9e0._12_4_ ^ 0x80000000;
                auVar204._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
                auVar204._8_4_ = auVar102._8_4_ ^ 0x80000000;
                auVar204._12_4_ = auVar102._12_4_ ^ 0x80000000;
                auVar156 = ZEXT416((uint)(auVar201._0_4_ * fVar217));
                auVar201 = vfmsub231ss_fma(ZEXT416((uint)(auVar102._0_4_ * local_9e0._0_4_)),
                                           auVar152,auVar156);
                auVar102 = vinsertps_avx(auVar204,auVar156,0x1c);
                uVar96 = auVar201._0_4_;
                auVar205._4_4_ = uVar96;
                auVar205._0_4_ = uVar96;
                auVar205._8_4_ = uVar96;
                auVar205._12_4_ = uVar96;
                auVar102 = vdivps_avx(auVar102,auVar205);
                auVar152 = vinsertps_avx(auVar152,auVar186,0x10);
                auVar152 = vdivps_avx(auVar152,auVar205);
                fVar200 = auVar133._0_4_;
                auVar157._0_4_ = fVar200 * auVar102._0_4_ + fVar220 * auVar152._0_4_;
                auVar157._4_4_ = fVar200 * auVar102._4_4_ + fVar220 * auVar152._4_4_;
                auVar157._8_4_ = fVar200 * auVar102._8_4_ + fVar220 * auVar152._8_4_;
                auVar157._12_4_ = fVar200 * auVar102._12_4_ + fVar220 * auVar152._12_4_;
                auVar102 = vsubps_avx(auVar164,auVar157);
                auVar264 = ZEXT1664(auVar102);
                auVar152 = vandps_avx(auVar133,auVar237);
                fVar200 = (float)local_980._0_4_;
                fVar217 = (float)local_980._4_4_;
                fVar216 = fStack_978;
                fVar215 = fStack_974;
                fVar259 = fStack_970;
                fVar219 = fStack_96c;
                fVar218 = fStack_968;
                if (auVar152._0_4_ < auVar281._0_4_) {
                  auVar133 = vfmadd231ss_fma(ZEXT416((uint)(auVar286._0_4_ + auVar281._0_4_)),
                                             auVar10,ZEXT416(0x36000000));
                  auVar152 = vandps_avx(ZEXT416((uint)fVar220),auVar237);
                  if (auVar152._0_4_ < auVar133._0_4_) {
                    fVar220 = auVar102._0_4_ + (float)local_8d0._0_4_;
                    if (fVar220 < fVar95) {
                      bVar94 = 0;
                    }
                    else {
                      fVar277 = *(float *)(ray + k * 4 + 0x80);
                      auVar281 = ZEXT464((uint)fVar277);
                      if (fVar277 < fVar220) {
                        bVar94 = 0;
                      }
                      else {
                        auVar152 = vmovshdup_avx(auVar102);
                        bVar94 = 0;
                        if ((0.0 <= auVar152._0_4_) && (auVar152._0_4_ <= 1.0)) {
                          auVar99 = vrsqrtss_avx(auVar99,auVar99);
                          fVar222 = auVar99._0_4_;
                          pGVar3 = (context->scene->geometries).items[uVar85].ptr;
                          if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar94 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar94 = 1, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar214 = fVar222 * 1.5 + fVar214 * -0.5 * fVar222 * fVar222 * fVar222;
                            local_ac0 = auVar107._0_4_;
                            fStack_abc = auVar107._4_4_;
                            fStack_ab8 = auVar107._8_4_;
                            fStack_ab4 = auVar107._12_4_;
                            auVar158._0_4_ = fVar214 * local_ac0;
                            auVar158._4_4_ = fVar214 * fStack_abc;
                            auVar158._8_4_ = fVar214 * fStack_ab8;
                            auVar158._12_4_ = fVar214 * fStack_ab4;
                            auVar133 = vfmadd213ps_fma(auVar132,auVar158,auVar98);
                            auVar99 = vshufps_avx(auVar158,auVar158,0xc9);
                            auVar152 = vshufps_avx(auVar98,auVar98,0xc9);
                            auVar159._0_4_ = auVar158._0_4_ * auVar152._0_4_;
                            auVar159._4_4_ = auVar158._4_4_ * auVar152._4_4_;
                            auVar159._8_4_ = auVar158._8_4_ * auVar152._8_4_;
                            auVar159._12_4_ = auVar158._12_4_ * auVar152._12_4_;
                            auVar107 = vfmsub231ps_fma(auVar159,auVar98,auVar99);
                            auVar99 = vshufps_avx(auVar107,auVar107,0xc9);
                            auVar152 = vshufps_avx(auVar133,auVar133,0xc9);
                            auVar107 = vshufps_avx(auVar107,auVar107,0xd2);
                            auVar105._0_4_ = auVar133._0_4_ * auVar107._0_4_;
                            auVar105._4_4_ = auVar133._4_4_ * auVar107._4_4_;
                            auVar105._8_4_ = auVar133._8_4_ * auVar107._8_4_;
                            auVar105._12_4_ = auVar133._12_4_ * auVar107._12_4_;
                            auVar99 = vfmsub231ps_fma(auVar105,auVar99,auVar152);
                            local_730 = vshufps_avx(auVar102,auVar102,0x55);
                            local_760 = (RTCHitN  [16])vshufps_avx(auVar99,auVar99,0x55);
                            auStack_750 = vshufps_avx(auVar99,auVar99,0xaa);
                            local_740 = auVar99._0_4_;
                            local_720 = ZEXT416(0) << 0x20;
                            local_710 = CONCAT44(uStack_77c,local_780);
                            uStack_708 = CONCAT44(uStack_774,uStack_778);
                            local_700._4_4_ = uStack_76c;
                            local_700._0_4_ = local_770;
                            local_700._8_4_ = uStack_768;
                            local_700._12_4_ = uStack_764;
                            vpcmpeqd_avx2(ZEXT1632(local_700),ZEXT1632(local_700));
                            uStack_6ec = context->user->instID[0];
                            local_6f0 = uStack_6ec;
                            uStack_6e8 = uStack_6ec;
                            uStack_6e4 = uStack_6ec;
                            uStack_6e0 = context->user->instPrimID[0];
                            uStack_6dc = uStack_6e0;
                            uStack_6d8 = uStack_6e0;
                            uStack_6d4 = uStack_6e0;
                            *(float *)(ray + k * 4 + 0x80) = fVar220;
                            auVar99 = *(undefined1 (*) [16])
                                       (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_900._0_16_ = auVar99;
                            local_a90.valid = (int *)local_900;
                            local_a90.geometryUserPtr = pGVar3->userPtr;
                            local_a90.context = context->user;
                            local_a90.hit = local_760;
                            local_a90.N = 4;
                            local_a90.ray = (RTCRayN *)ray;
                            uStack_73c = local_740;
                            uStack_738 = local_740;
                            uStack_734 = local_740;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar264 = ZEXT1664(auVar102);
                              auVar275 = ZEXT1664(auVar98);
                              auVar286 = ZEXT1664(auVar286._0_16_);
                              (*pGVar3->occlusionFilterN)(&local_a90);
                              auVar99 = local_900._0_16_;
                              fVar200 = (float)local_980._0_4_;
                              fVar217 = (float)local_980._4_4_;
                              fVar216 = fStack_978;
                              fVar215 = fStack_974;
                              fVar259 = fStack_970;
                              fVar219 = fStack_96c;
                              fVar218 = fStack_968;
                            }
                            if (auVar99 == (undefined1  [16])0x0) {
                              auVar99 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar99 = auVar99 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar264 = ZEXT1664(auVar264._0_16_);
                                auVar275 = ZEXT1664(auVar275._0_16_);
                                auVar286 = ZEXT1664(auVar286._0_16_);
                                (*p_Var4)(&local_a90);
                                auVar99 = local_900._0_16_;
                                fVar200 = (float)local_980._0_4_;
                                fVar217 = (float)local_980._4_4_;
                                fVar216 = fStack_978;
                                fVar215 = fStack_974;
                                fVar259 = fStack_970;
                                fVar219 = fStack_96c;
                                fVar218 = fStack_968;
                              }
                              auVar152 = vpcmpeqd_avx(auVar99,_DAT_01f7aa10);
                              auVar99 = auVar152 ^ _DAT_01f7ae20;
                              auVar160._8_4_ = 0xff800000;
                              auVar160._0_8_ = 0xff800000ff800000;
                              auVar160._12_4_ = 0xff800000;
                              auVar152 = vblendvps_avx(auVar160,*(undefined1 (*) [16])
                                                                 (local_a90.ray + 0x80),auVar152);
                              *(undefined1 (*) [16])(local_a90.ray + 0x80) = auVar152;
                            }
                            auVar281 = ZEXT464((uint)fVar277);
                            auVar136._8_8_ = 0x100000001;
                            auVar136._0_8_ = 0x100000001;
                            bVar94 = (auVar136 & auVar99) != (undefined1  [16])0x0;
                            if (!(bool)bVar94) {
                              *(float *)(ray + k * 4 + 0x80) = fVar277;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_01654746;
                  }
                }
                bVar93 = uVar91 < 4;
                uVar91 = uVar91 + 1;
              } while (uVar91 != 5);
              bVar93 = false;
              bVar94 = 5;
LAB_01654746:
              bVar92 = (bool)(bVar92 | bVar93 & bVar94);
              uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar119._4_4_ = uVar96;
              auVar119._0_4_ = uVar96;
              auVar119._8_4_ = uVar96;
              auVar119._12_4_ = uVar96;
              auVar119._16_4_ = uVar96;
              auVar119._20_4_ = uVar96;
              auVar119._24_4_ = uVar96;
              auVar119._28_4_ = uVar96;
              auVar146 = vcmpps_avx(_local_840,auVar119,2);
              auVar113 = vandps_avx(auVar146,local_5e0);
              auVar177 = ZEXT3264(auVar113);
              auVar146 = local_5e0 & auVar146;
              local_5e0 = auVar113;
            } while ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar146 >> 0x7f,0) != '\0') ||
                       (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar146 >> 0xbf,0) != '\0') ||
                     (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar146[0x1f] < '\0');
            auVar177 = ZEXT3264(local_3c0);
            auVar244 = ZEXT3264(local_a40);
            auVar113 = local_660;
          }
          auVar13 = local_3c0;
          auVar150._0_4_ = fVar200 * (float)local_6a0._0_4_;
          auVar150._4_4_ = fVar217 * (float)local_6a0._4_4_;
          auVar150._8_4_ = fVar216 * fStack_698;
          auVar150._12_4_ = fVar215 * fStack_694;
          auVar150._16_4_ = fVar259 * fStack_690;
          auVar150._20_4_ = fVar219 * fStack_68c;
          auVar150._28_36_ = auVar177._28_36_;
          auVar150._24_4_ = fVar218 * fStack_688;
          auVar10 = vfmadd213ps_fma(local_8a0,_local_a60,auVar150._0_32_);
          auVar10 = vfmadd213ps_fma(local_880,_local_820,ZEXT1632(auVar10));
          auVar62._4_4_ = uStack_85c;
          auVar62._0_4_ = local_860;
          auVar62._8_4_ = uStack_858;
          auVar62._12_4_ = uStack_854;
          auVar62._16_4_ = uStack_850;
          auVar62._20_4_ = uStack_84c;
          auVar62._24_4_ = uStack_848;
          auVar62._28_4_ = uStack_844;
          auVar146 = vandps_avx(ZEXT1632(auVar10),auVar62);
          auVar173._8_4_ = 0x3e99999a;
          auVar173._0_8_ = 0x3e99999a3e99999a;
          auVar173._12_4_ = 0x3e99999a;
          auVar173._16_4_ = 0x3e99999a;
          auVar173._20_4_ = 0x3e99999a;
          auVar173._24_4_ = 0x3e99999a;
          auVar173._28_4_ = 0x3e99999a;
          auVar146 = vcmpps_avx(auVar146,auVar173,1);
          auVar7 = vorps_avx(auVar146,local_620);
          auVar174._0_4_ = (float)local_920._0_4_ + auVar244._0_4_;
          auVar174._4_4_ = (float)local_920._4_4_ + auVar244._4_4_;
          auVar174._8_4_ = fStack_918 + auVar244._8_4_;
          auVar174._12_4_ = fStack_914 + auVar244._12_4_;
          auVar174._16_4_ = fStack_910 + auVar244._16_4_;
          auVar174._20_4_ = fStack_90c + auVar244._20_4_;
          auVar174._24_4_ = fStack_908 + auVar244._24_4_;
          auVar174._28_4_ = fStack_904 + auVar244._28_4_;
          auVar146 = vcmpps_avx(auVar174,auVar119,2);
          local_880 = vandps_avx(auVar113,auVar146);
          auVar175._8_4_ = 3;
          auVar175._0_8_ = 0x300000003;
          auVar175._12_4_ = 3;
          auVar175._16_4_ = 3;
          auVar175._20_4_ = 3;
          auVar175._24_4_ = 3;
          auVar175._28_4_ = 3;
          auVar198._8_4_ = 2;
          auVar198._0_8_ = 0x200000002;
          auVar198._12_4_ = 2;
          auVar198._16_4_ = 2;
          auVar198._20_4_ = 2;
          auVar198._24_4_ = 2;
          auVar198._28_4_ = 2;
          auVar113 = vblendvps_avx(auVar198,auVar175,auVar7);
          local_8a0 = vpcmpgtd_avx2(auVar113,local_640);
          auVar113 = vpandn_avx2(local_8a0,local_880);
          auVar146 = local_880 & ~local_8a0;
          local_900 = auVar113;
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0x7f,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0xbf,0) != '\0') ||
              (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar146[0x1f] < '\0') {
            auVar99 = vminps_avx(auVar11,auVar100);
            auVar10 = vmaxps_avx(auVar11,auVar100);
            auVar152 = vminps_avx(auVar8,auVar9);
            auVar107 = vminps_avx(auVar99,auVar152);
            auVar99 = vmaxps_avx(auVar8,auVar9);
            auVar152 = vmaxps_avx(auVar10,auVar99);
            auVar10 = vandps_avx(auVar107,auVar237);
            auVar99 = vandps_avx(auVar152,auVar237);
            auVar10 = vmaxps_avx(auVar10,auVar99);
            auVar99 = vmovshdup_avx(auVar10);
            auVar99 = vmaxss_avx(auVar99,auVar10);
            auVar10 = vshufpd_avx(auVar10,auVar10,1);
            auVar10 = vmaxss_avx(auVar10,auVar99);
            local_960._0_4_ = auVar10._0_4_ * 1.9073486e-06;
            local_800._0_16_ = vshufps_avx(auVar152,auVar152,0xff);
            local_840._4_4_ = (float)local_920._4_4_ + local_3c0._4_4_;
            local_840._0_4_ = (float)local_920._0_4_ + local_3c0._0_4_;
            fStack_838 = fStack_918 + local_3c0._8_4_;
            fStack_834 = fStack_914 + local_3c0._12_4_;
            fStack_830 = fStack_910 + local_3c0._16_4_;
            fStack_82c = fStack_90c + local_3c0._20_4_;
            fStack_828 = fStack_908 + local_3c0._24_4_;
            fStack_824 = fStack_904 + local_3c0._28_4_;
            do {
              auVar121._8_4_ = 0x7f800000;
              auVar121._0_8_ = 0x7f8000007f800000;
              auVar121._12_4_ = 0x7f800000;
              auVar121._16_4_ = 0x7f800000;
              auVar121._20_4_ = 0x7f800000;
              auVar121._24_4_ = 0x7f800000;
              auVar121._28_4_ = 0x7f800000;
              auVar146 = vblendvps_avx(auVar121,auVar13,auVar113);
              auVar7 = vshufps_avx(auVar146,auVar146,0xb1);
              auVar7 = vminps_avx(auVar146,auVar7);
              auVar15 = vshufpd_avx(auVar7,auVar7,5);
              auVar7 = vminps_avx(auVar7,auVar15);
              auVar15 = vpermpd_avx2(auVar7,0x4e);
              auVar7 = vminps_avx(auVar7,auVar15);
              auVar7 = vcmpps_avx(auVar146,auVar7,0);
              auVar15 = auVar113 & auVar7;
              auVar146 = auVar113;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar146 = vandps_avx(auVar7,auVar113);
              }
              uVar87 = vmovmskps_avx(auVar146);
              iVar24 = 0;
              for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar88 = iVar24 << 2;
              local_900 = auVar113;
              *(undefined4 *)(local_900 + uVar88) = 0;
              uVar87 = *(uint *)(local_1c0 + uVar88);
              uVar88 = *(uint *)(local_3a0 + uVar88);
              fVar200 = auVar6._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar200 = sqrtf((float)local_9c0._0_4_);
              }
              local_9e0._0_4_ = fVar200 * 1.9073486e-06;
              auVar10 = vinsertps_avx(ZEXT416(uVar88),ZEXT416(uVar87),0x10);
              auVar264 = ZEXT1664(auVar10);
              bVar93 = true;
              uVar91 = 0;
              do {
                auVar133 = auVar264._0_16_;
                auVar99 = vmovshdup_avx(auVar133);
                fVar215 = auVar99._0_4_;
                fVar216 = 1.0 - fVar215;
                fVar220 = fVar216 * fVar216 * fVar216;
                fVar217 = fVar215 * fVar215 * fVar215;
                auVar152 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                           ZEXT416((uint)fVar217));
                fVar200 = fVar215 * fVar216;
                auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar200 * 6.0)),
                                           ZEXT416((uint)(fVar216 * fVar200)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar200 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar215 * fVar200)));
                auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar217),
                                          ZEXT416((uint)fVar220));
                fVar214 = (auVar10._0_4_ + auVar102._0_4_) * 0.16666667;
                fVar217 = fVar217 * 0.16666667;
                auVar137._0_4_ = fVar217 * fVar125;
                auVar137._4_4_ = fVar217 * fStack_b3c;
                auVar137._8_4_ = fVar217 * fStack_b38;
                auVar137._12_4_ = fVar217 * fStack_b34;
                auVar187._4_4_ = fVar214;
                auVar187._0_4_ = fVar214;
                auVar187._8_4_ = fVar214;
                auVar187._12_4_ = fVar214;
                auVar10 = vfmadd132ps_fma(auVar187,auVar137,auVar8);
                fVar214 = (auVar152._0_4_ + auVar107._0_4_) * 0.16666667;
                auVar138._4_4_ = fVar214;
                auVar138._0_4_ = fVar214;
                auVar138._8_4_ = fVar214;
                auVar138._12_4_ = fVar214;
                auVar10 = vfmadd132ps_fma(auVar138,auVar10,auVar100);
                fVar217 = auVar264._0_4_;
                auVar161._4_4_ = fVar217;
                auVar161._0_4_ = fVar217;
                auVar161._8_4_ = fVar217;
                auVar161._12_4_ = fVar217;
                auVar152 = vfmadd213ps_fma(auVar161,local_9b0,_DAT_01f7aa10);
                fVar220 = fVar220 * 0.16666667;
                auVar106._4_4_ = fVar220;
                auVar106._0_4_ = fVar220;
                auVar106._8_4_ = fVar220;
                auVar106._12_4_ = fVar220;
                auVar10 = vfmadd132ps_fma(auVar106,auVar10,auVar11);
                local_7a0._0_16_ = auVar10;
                auVar152 = vsubps_avx(auVar152,auVar10);
                auVar10 = vdpps_avx(auVar152,auVar152,0x7f);
                fVar214 = auVar10._0_4_;
                if (fVar214 < 0.0) {
                  local_a00._0_4_ = fVar200;
                  auVar264._0_4_ = sqrtf(fVar214);
                  auVar264._4_60_ = extraout_var_00;
                  auVar107 = auVar264._0_16_;
                  fVar200 = (float)local_a00._0_4_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar10,auVar10);
                }
                auVar98 = ZEXT416((uint)fVar216);
                auVar108._4_4_ = fVar216;
                auVar108._0_4_ = fVar216;
                auVar108._8_4_ = fVar216;
                auVar108._12_4_ = fVar216;
                auVar164 = vfnmsub213ss_fma(auVar99,auVar99,ZEXT416((uint)(fVar200 * 4.0)));
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * 4.0)),auVar98,auVar98);
                fVar200 = fVar216 * -fVar216 * 0.5;
                fVar220 = auVar164._0_4_ * 0.5;
                fVar216 = auVar102._0_4_ * 0.5;
                fVar215 = fVar215 * fVar215 * 0.5;
                auVar229._0_4_ = fVar125 * fVar215;
                auVar229._4_4_ = fStack_b3c * fVar215;
                auVar229._8_4_ = fStack_b38 * fVar215;
                auVar229._12_4_ = fStack_b34 * fVar215;
                auVar188._4_4_ = fVar216;
                auVar188._0_4_ = fVar216;
                auVar188._8_4_ = fVar216;
                auVar188._12_4_ = fVar216;
                auVar102 = vfmadd213ps_fma(auVar188,auVar8,auVar229);
                auVar206._4_4_ = fVar220;
                auVar206._0_4_ = fVar220;
                auVar206._8_4_ = fVar220;
                auVar206._12_4_ = fVar220;
                auVar102 = vfmadd213ps_fma(auVar206,auVar100,auVar102);
                auVar274._4_4_ = fVar200;
                auVar274._0_4_ = fVar200;
                auVar274._8_4_ = fVar200;
                auVar274._12_4_ = fVar200;
                auVar201 = vfmadd213ps_fma(auVar274,auVar11,auVar102);
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar98,auVar99);
                auVar164 = vfmadd213ss_fma(auVar99,SUB6416(ZEXT464(0xc0000000),0),auVar98);
                auVar99 = vshufps_avx(auVar133,auVar133,0x55);
                auVar189._0_4_ = fVar125 * auVar99._0_4_;
                auVar189._4_4_ = fStack_b3c * auVar99._4_4_;
                auVar189._8_4_ = fStack_b38 * auVar99._8_4_;
                auVar189._12_4_ = fStack_b34 * auVar99._12_4_;
                uVar96 = auVar164._0_4_;
                auVar207._4_4_ = uVar96;
                auVar207._0_4_ = uVar96;
                auVar207._8_4_ = uVar96;
                auVar207._12_4_ = uVar96;
                auVar99 = vfmadd213ps_fma(auVar207,auVar8,auVar189);
                auVar162._0_4_ = auVar102._0_4_;
                auVar162._4_4_ = auVar162._0_4_;
                auVar162._8_4_ = auVar162._0_4_;
                auVar162._12_4_ = auVar162._0_4_;
                auVar99 = vfmadd213ps_fma(auVar162,auVar100,auVar99);
                auVar98 = vfmadd231ps_fma(auVar99,auVar11,auVar108);
                auVar102 = vdpps_avx(auVar201,auVar201,0x7f);
                auVar99 = vblendps_avx(auVar102,_DAT_01f7aa10,0xe);
                auVar164 = vrsqrtss_avx(auVar99,auVar99);
                fVar200 = auVar164._0_4_;
                fVar216 = auVar102._0_4_;
                fVar200 = fVar200 * 1.5 + fVar216 * -0.5 * fVar200 * fVar200 * fVar200;
                auVar164 = vdpps_avx(auVar201,auVar98,0x7f);
                auVar163._0_4_ = auVar98._0_4_ * fVar216;
                auVar163._4_4_ = auVar98._4_4_ * fVar216;
                auVar163._8_4_ = auVar98._8_4_ * fVar216;
                auVar163._12_4_ = auVar98._12_4_ * fVar216;
                fVar220 = auVar164._0_4_;
                auVar230._0_4_ = auVar201._0_4_ * fVar220;
                auVar230._4_4_ = auVar201._4_4_ * fVar220;
                fVar215 = auVar201._8_4_;
                auVar230._8_4_ = fVar215 * fVar220;
                fVar259 = auVar201._12_4_;
                auVar230._12_4_ = fVar259 * fVar220;
                auVar164 = vsubps_avx(auVar163,auVar230);
                auVar99 = vrcpss_avx(auVar99,auVar99);
                auVar98 = vfnmadd213ss_fma(auVar99,auVar102,ZEXT416(0x40000000));
                fVar220 = auVar99._0_4_ * auVar98._0_4_;
                auVar99 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                     ZEXT416((uint)(fVar217 * (float)local_9e0._0_4_)));
                auVar177 = ZEXT1664(auVar99);
                auVar240._0_8_ = auVar201._0_8_ ^ 0x8000000080000000;
                auVar240._8_4_ = -fVar215;
                auVar240._12_4_ = -fVar259;
                auVar190._0_4_ = fVar200 * auVar164._0_4_ * fVar220;
                auVar190._4_4_ = fVar200 * auVar164._4_4_ * fVar220;
                auVar190._8_4_ = fVar200 * auVar164._8_4_ * fVar220;
                auVar190._12_4_ = fVar200 * auVar164._12_4_ * fVar220;
                auVar262._0_4_ = auVar201._0_4_ * fVar200;
                auVar262._4_4_ = auVar201._4_4_ * fVar200;
                auVar262._8_4_ = fVar215 * fVar200;
                auVar262._12_4_ = fVar259 * fVar200;
                if (fVar216 < -fVar216) {
                  local_a00._0_16_ = auVar240;
                  local_a40._0_16_ = auVar262;
                  local_a20._0_16_ = auVar190;
                  fVar200 = sqrtf(fVar216);
                  auVar177 = ZEXT464(auVar99._0_4_);
                  auVar107 = ZEXT416(auVar107._0_4_);
                  auVar190 = local_a20._0_16_;
                  auVar240 = local_a00._0_16_;
                  auVar262 = local_a40._0_16_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar200 = auVar102._0_4_;
                }
                auVar102 = vdpps_avx(auVar152,auVar262,0x7f);
                auVar156 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar107,auVar177._0_16_);
                auVar164 = vdpps_avx(auVar240,auVar262,0x7f);
                auVar98 = vdpps_avx(auVar152,auVar190,0x7f);
                auVar132 = vdpps_avx(local_9b0,auVar262,0x7f);
                auVar156 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_960._0_4_ / fVar200)),
                                           auVar156);
                auVar281 = ZEXT1664(auVar156);
                fVar200 = auVar164._0_4_ + auVar98._0_4_;
                auVar286 = ZEXT464((uint)fVar200);
                fVar220 = auVar102._0_4_;
                auVar109._0_4_ = fVar220 * fVar220;
                auVar109._4_4_ = auVar102._4_4_ * auVar102._4_4_;
                auVar109._8_4_ = auVar102._8_4_ * auVar102._8_4_;
                auVar109._12_4_ = auVar102._12_4_ * auVar102._12_4_;
                auVar107 = vdpps_avx(auVar152,auVar240,0x7f);
                auVar98 = vsubps_avx(auVar10,auVar109);
                auVar164 = vrsqrtss_avx(auVar98,auVar98);
                fVar216 = auVar98._0_4_;
                fVar217 = auVar164._0_4_;
                fVar217 = fVar217 * 1.5 + fVar216 * -0.5 * fVar217 * fVar217 * fVar217;
                auVar164 = vdpps_avx(auVar152,local_9b0,0x7f);
                auVar107 = vfnmadd231ss_fma(auVar107,auVar102,ZEXT416((uint)fVar200));
                auVar164 = vfnmadd231ss_fma(auVar164,auVar102,auVar132);
                if (fVar216 < 0.0) {
                  local_a00._0_4_ = auVar156._0_4_;
                  local_a40._0_16_ = ZEXT416((uint)fVar200);
                  local_a20._0_16_ = auVar132;
                  local_940._0_16_ = auVar107;
                  local_7c0._0_4_ = fVar217;
                  local_7e0._0_16_ = auVar164;
                  fVar200 = sqrtf(fVar216);
                  auVar286 = ZEXT1664(local_a40._0_16_);
                  auVar281 = ZEXT464((uint)local_a00._0_4_);
                  auVar177 = ZEXT464(auVar99._0_4_);
                  fVar217 = (float)local_7c0._0_4_;
                  auVar164 = local_7e0._0_16_;
                  auVar132 = local_a20._0_16_;
                  auVar107 = local_940._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar98,auVar98);
                  fVar200 = auVar99._0_4_;
                }
                auVar275 = ZEXT1664(auVar102);
                auVar244 = ZEXT1664(auVar201);
                auVar99 = vpermilps_avx(local_7a0._0_16_,0xff);
                fVar200 = fVar200 - auVar99._0_4_;
                auVar98 = vshufps_avx(auVar201,auVar201,0xff);
                auVar99 = vfmsub213ss_fma(auVar107,ZEXT416((uint)fVar217),auVar98);
                auVar191._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
                auVar191._8_4_ = auVar132._8_4_ ^ 0x80000000;
                auVar191._12_4_ = auVar132._12_4_ ^ 0x80000000;
                auVar208._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
                auVar208._8_4_ = auVar99._8_4_ ^ 0x80000000;
                auVar208._12_4_ = auVar99._12_4_ ^ 0x80000000;
                auVar164 = ZEXT416((uint)(auVar164._0_4_ * fVar217));
                auVar156 = auVar286._0_16_;
                auVar107 = vfmsub231ss_fma(ZEXT416((uint)(auVar132._0_4_ * auVar99._0_4_)),auVar156,
                                           auVar164);
                auVar99 = vinsertps_avx(auVar208,auVar164,0x1c);
                uVar96 = auVar107._0_4_;
                auVar209._4_4_ = uVar96;
                auVar209._0_4_ = uVar96;
                auVar209._8_4_ = uVar96;
                auVar209._12_4_ = uVar96;
                auVar99 = vdivps_avx(auVar99,auVar209);
                auVar107 = vinsertps_avx(auVar156,auVar191,0x10);
                auVar107 = vdivps_avx(auVar107,auVar209);
                auVar165._0_4_ = fVar220 * auVar99._0_4_ + fVar200 * auVar107._0_4_;
                auVar165._4_4_ = fVar220 * auVar99._4_4_ + fVar200 * auVar107._4_4_;
                auVar165._8_4_ = fVar220 * auVar99._8_4_ + fVar200 * auVar107._8_4_;
                auVar165._12_4_ = fVar220 * auVar99._12_4_ + fVar200 * auVar107._12_4_;
                auVar107 = vsubps_avx(auVar133,auVar165);
                auVar264 = ZEXT1664(auVar107);
                auVar99 = vandps_avx(auVar102,auVar237);
                if (auVar99._0_4_ < auVar281._0_4_) {
                  auVar133 = vfmadd231ss_fma(ZEXT416((uint)(auVar177._0_4_ + auVar281._0_4_)),
                                             local_800._0_16_,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(ZEXT416((uint)fVar200),auVar237);
                  if (auVar99._0_4_ < auVar133._0_4_) {
                    fVar200 = auVar107._0_4_ + (float)local_8d0._0_4_;
                    if (fVar200 < fVar95) {
                      bVar94 = 0;
                    }
                    else {
                      fVar217 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar217 < fVar200) {
                        bVar94 = 0;
                      }
                      else {
                        auVar99 = vmovshdup_avx(auVar107);
                        bVar94 = 0;
                        if ((0.0 <= auVar99._0_4_) && (auVar99._0_4_ <= 1.0)) {
                          auVar10 = vrsqrtss_avx(auVar10,auVar10);
                          fVar220 = auVar10._0_4_;
                          pGVar3 = (context->scene->geometries).items[uVar85].ptr;
                          if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar94 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar94 = 1, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar214 = fVar220 * 1.5 + fVar214 * -0.5 * fVar220 * fVar220 * fVar220;
                            local_ac0 = auVar152._0_4_;
                            fStack_abc = auVar152._4_4_;
                            fStack_ab8 = auVar152._8_4_;
                            fStack_ab4 = auVar152._12_4_;
                            auVar166._0_4_ = fVar214 * local_ac0;
                            auVar166._4_4_ = fVar214 * fStack_abc;
                            auVar166._8_4_ = fVar214 * fStack_ab8;
                            auVar166._12_4_ = fVar214 * fStack_ab4;
                            auVar133 = vfmadd213ps_fma(auVar98,auVar166,auVar201);
                            auVar10 = vshufps_avx(auVar166,auVar166,0xc9);
                            auVar99 = vshufps_avx(auVar201,auVar201,0xc9);
                            auVar167._0_4_ = auVar166._0_4_ * auVar99._0_4_;
                            auVar167._4_4_ = auVar166._4_4_ * auVar99._4_4_;
                            auVar167._8_4_ = auVar166._8_4_ * auVar99._8_4_;
                            auVar167._12_4_ = auVar166._12_4_ * auVar99._12_4_;
                            auVar152 = vfmsub231ps_fma(auVar167,auVar201,auVar10);
                            auVar10 = vshufps_avx(auVar152,auVar152,0xc9);
                            auVar99 = vshufps_avx(auVar133,auVar133,0xc9);
                            auVar152 = vshufps_avx(auVar152,auVar152,0xd2);
                            auVar110._0_4_ = auVar133._0_4_ * auVar152._0_4_;
                            auVar110._4_4_ = auVar133._4_4_ * auVar152._4_4_;
                            auVar110._8_4_ = auVar133._8_4_ * auVar152._8_4_;
                            auVar110._12_4_ = auVar133._12_4_ * auVar152._12_4_;
                            auVar10 = vfmsub231ps_fma(auVar110,auVar10,auVar99);
                            local_730 = vshufps_avx(auVar107,auVar107,0x55);
                            local_760 = (RTCHitN  [16])vshufps_avx(auVar10,auVar10,0x55);
                            auStack_750 = vshufps_avx(auVar10,auVar10,0xaa);
                            local_740 = auVar10._0_4_;
                            local_720 = ZEXT416(0) << 0x20;
                            local_710 = CONCAT44(uStack_77c,local_780);
                            uStack_708 = CONCAT44(uStack_774,uStack_778);
                            local_700._4_4_ = uStack_76c;
                            local_700._0_4_ = local_770;
                            local_700._8_4_ = uStack_768;
                            local_700._12_4_ = uStack_764;
                            vpcmpeqd_avx2(ZEXT1632(local_700),ZEXT1632(local_700));
                            uStack_6ec = context->user->instID[0];
                            local_6f0 = uStack_6ec;
                            uStack_6e8 = uStack_6ec;
                            uStack_6e4 = uStack_6ec;
                            uStack_6e0 = context->user->instPrimID[0];
                            uStack_6dc = uStack_6e0;
                            uStack_6d8 = uStack_6e0;
                            uStack_6d4 = uStack_6e0;
                            *(float *)(ray + k * 4 + 0x80) = fVar200;
                            local_8c0 = *(undefined1 (*) [16])
                                         (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_a90.valid = (int *)local_8c0;
                            local_a90.geometryUserPtr = pGVar3->userPtr;
                            local_a90.context = context->user;
                            local_a90.hit = local_760;
                            local_a90.N = 4;
                            local_a90.ray = (RTCRayN *)ray;
                            uStack_73c = local_740;
                            uStack_738 = local_740;
                            uStack_734 = local_740;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar244 = ZEXT1664(auVar201);
                              auVar264 = ZEXT1664(auVar107);
                              auVar275 = ZEXT1664(auVar102);
                              auVar281 = ZEXT1664(auVar281._0_16_);
                              auVar286 = ZEXT1664(auVar156);
                              (*pGVar3->occlusionFilterN)(&local_a90);
                            }
                            if (local_8c0 == (undefined1  [16])0x0) {
                              auVar10 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar10 = auVar10 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar244 = ZEXT1664(auVar244._0_16_);
                                auVar264 = ZEXT1664(auVar264._0_16_);
                                auVar275 = ZEXT1664(auVar275._0_16_);
                                auVar281 = ZEXT1664(auVar281._0_16_);
                                auVar286 = ZEXT1664(auVar286._0_16_);
                                (*p_Var4)(&local_a90);
                              }
                              auVar99 = vpcmpeqd_avx(local_8c0,_DAT_01f7aa10);
                              auVar10 = auVar99 ^ _DAT_01f7ae20;
                              auVar168._8_4_ = 0xff800000;
                              auVar168._0_8_ = 0xff800000ff800000;
                              auVar168._12_4_ = 0xff800000;
                              auVar99 = vblendvps_avx(auVar168,*(undefined1 (*) [16])
                                                                (local_a90.ray + 0x80),auVar99);
                              *(undefined1 (*) [16])(local_a90.ray + 0x80) = auVar99;
                            }
                            auVar139._8_8_ = 0x100000001;
                            auVar139._0_8_ = 0x100000001;
                            bVar94 = (auVar139 & auVar10) != (undefined1  [16])0x0;
                            if (!(bool)bVar94) {
                              *(float *)(ray + k * 4 + 0x80) = fVar217;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_0165523d;
                  }
                }
                bVar93 = uVar91 < 4;
                uVar91 = uVar91 + 1;
              } while (uVar91 != 5);
              bVar93 = false;
              bVar94 = 5;
LAB_0165523d:
              bVar92 = (bool)(bVar92 | bVar93 & bVar94);
              uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar119._4_4_ = uVar96;
              auVar119._0_4_ = uVar96;
              auVar119._8_4_ = uVar96;
              auVar119._12_4_ = uVar96;
              auVar119._16_4_ = uVar96;
              auVar119._20_4_ = uVar96;
              auVar119._24_4_ = uVar96;
              auVar119._28_4_ = uVar96;
              auVar146 = vcmpps_avx(_local_840,auVar119,2);
              auVar113 = vandps_avx(auVar146,local_900);
              auVar146 = local_900 & auVar146;
              local_900 = auVar113;
            } while ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar146 >> 0x7f,0) != '\0') ||
                       (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar146 >> 0xbf,0) != '\0') ||
                     (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar146[0x1f] < '\0');
          }
          auVar176._0_4_ = (float)local_920._0_4_ + local_400._0_4_;
          auVar176._4_4_ = (float)local_920._4_4_ + local_400._4_4_;
          auVar176._8_4_ = fStack_918 + local_400._8_4_;
          auVar176._12_4_ = fStack_914 + local_400._12_4_;
          auVar176._16_4_ = fStack_910 + local_400._16_4_;
          auVar176._20_4_ = fStack_90c + local_400._20_4_;
          auVar176._24_4_ = fStack_908 + local_400._24_4_;
          auVar176._28_4_ = fStack_904 + local_400._28_4_;
          auVar146 = vcmpps_avx(auVar176,auVar119,2);
          auVar113 = vandps_avx(local_6c0,local_600);
          auVar113 = vandps_avx(auVar146,auVar113);
          auVar199._0_4_ = (float)local_920._0_4_ + local_3c0._0_4_;
          auVar199._4_4_ = (float)local_920._4_4_ + local_3c0._4_4_;
          auVar199._8_4_ = fStack_918 + local_3c0._8_4_;
          auVar199._12_4_ = fStack_914 + local_3c0._12_4_;
          auVar199._16_4_ = fStack_910 + local_3c0._16_4_;
          auVar199._20_4_ = fStack_90c + local_3c0._20_4_;
          auVar199._24_4_ = fStack_908 + local_3c0._24_4_;
          auVar199._28_4_ = fStack_904 + local_3c0._28_4_;
          auVar7 = vcmpps_avx(auVar199,auVar119,2);
          auVar146 = vandps_avx(local_8a0,local_880);
          auVar146 = vandps_avx(auVar7,auVar146);
          auVar146 = vorps_avx(auVar113,auVar146);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0x7f,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0xbf,0) != '\0') ||
              (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar146[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar90 * 0x60) = auVar146;
            auVar113 = vblendvps_avx(local_3c0,local_400,auVar113);
            *(undefined1 (*) [32])(auStack_160 + uVar90 * 0x60) = auVar113;
            uVar1 = vmovlps_avx(local_590);
            (&uStack_140)[uVar90 * 0xc] = uVar1;
            aiStack_138[uVar90 * 0x18] = local_c08 + 1;
            iVar89 = iVar89 + 1;
          }
        }
      }
    }
    if (iVar89 == 0) break;
    uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar122._4_4_ = uVar96;
    auVar122._0_4_ = uVar96;
    auVar122._8_4_ = uVar96;
    auVar122._12_4_ = uVar96;
    auVar122._16_4_ = uVar96;
    auVar122._20_4_ = uVar96;
    auVar122._24_4_ = uVar96;
    auVar122._28_4_ = uVar96;
    uVar87 = -iVar89;
    pauVar86 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar89 - 1) * 0x60);
    fVar200 = (float)local_920._0_4_;
    fVar214 = (float)local_920._4_4_;
    fVar217 = fStack_918;
    fVar220 = fStack_914;
    fVar216 = fStack_910;
    fVar215 = fStack_90c;
    fVar259 = fStack_908;
    fVar219 = fStack_904;
    while( true ) {
      auVar113 = pauVar86[1];
      auVar147._0_4_ = fVar200 + auVar113._0_4_;
      auVar147._4_4_ = fVar214 + auVar113._4_4_;
      auVar147._8_4_ = fVar217 + auVar113._8_4_;
      auVar147._12_4_ = fVar220 + auVar113._12_4_;
      auVar147._16_4_ = fVar216 + auVar113._16_4_;
      auVar147._20_4_ = fVar215 + auVar113._20_4_;
      auVar147._24_4_ = fVar259 + auVar113._24_4_;
      auVar147._28_4_ = fVar219 + auVar113._28_4_;
      auVar146 = vcmpps_avx(auVar147,auVar122,2);
      _local_760 = vandps_avx(auVar146,*pauVar86);
      auVar146 = *pauVar86 & auVar146;
      if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar146 >> 0x7f,0) != '\0') ||
            (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar146 >> 0xbf,0) != '\0') ||
          (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar146[0x1f] < '\0') break;
      pauVar86 = pauVar86 + -3;
      uVar87 = uVar87 + 1;
      fVar200 = (float)local_920._0_4_;
      fVar214 = (float)local_920._4_4_;
      fVar217 = fStack_918;
      fVar220 = fStack_914;
      fVar216 = fStack_910;
      fVar215 = fStack_90c;
      fVar259 = fStack_908;
      fVar219 = fStack_904;
      if (uVar87 == 0) goto LAB_01655823;
    }
    auVar123._8_4_ = 0x7f800000;
    auVar123._0_8_ = 0x7f8000007f800000;
    auVar123._12_4_ = 0x7f800000;
    auVar123._16_4_ = 0x7f800000;
    auVar123._20_4_ = 0x7f800000;
    auVar123._24_4_ = 0x7f800000;
    auVar123._28_4_ = 0x7f800000;
    auVar113 = vblendvps_avx(auVar123,auVar113,_local_760);
    auVar146 = vshufps_avx(auVar113,auVar113,0xb1);
    auVar146 = vminps_avx(auVar113,auVar146);
    auVar7 = vshufpd_avx(auVar146,auVar146,5);
    auVar146 = vminps_avx(auVar146,auVar7);
    auVar7 = vpermpd_avx2(auVar146,0x4e);
    auVar146 = vminps_avx(auVar146,auVar7);
    auVar146 = vcmpps_avx(auVar113,auVar146,0);
    auVar7 = _local_760 & auVar146;
    auVar113 = _local_760;
    if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar7 >> 0x7f,0) != '\0') ||
          (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar7 >> 0xbf,0) != '\0') ||
        (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar7[0x1f] < '\0') {
      auVar113 = vandps_avx(auVar146,_local_760);
    }
    uVar91 = *(ulong *)pauVar86[2];
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar91;
    uVar88 = vmovmskps_avx(auVar113);
    iVar89 = 0;
    for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
      iVar89 = iVar89 + 1;
    }
    *(undefined4 *)(local_760 + (uint)(iVar89 << 2)) = 0;
    uVar88 = ~uVar87;
    if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_760 >> 0x7f,0) != '\0') ||
          (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_760 >> 0xbf,0) != '\0') ||
        (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_760[0x1f] < '\0') {
      uVar88 = -uVar87;
    }
    uVar90 = (ulong)uVar88;
    local_c08 = *(int *)(pauVar86[2] + 8);
    *pauVar86 = _local_760;
    uVar96 = (undefined4)uVar91;
    auVar148._4_4_ = uVar96;
    auVar148._0_4_ = uVar96;
    auVar148._8_4_ = uVar96;
    auVar148._12_4_ = uVar96;
    auVar148._16_4_ = uVar96;
    auVar148._20_4_ = uVar96;
    auVar148._24_4_ = uVar96;
    auVar148._28_4_ = uVar96;
    auVar10 = vmovshdup_avx(auVar111);
    auVar10 = vsubps_avx(auVar10,auVar111);
    auVar124._0_4_ = auVar10._0_4_;
    auVar124._4_4_ = auVar124._0_4_;
    auVar124._8_4_ = auVar124._0_4_;
    auVar124._12_4_ = auVar124._0_4_;
    auVar124._16_4_ = auVar124._0_4_;
    auVar124._20_4_ = auVar124._0_4_;
    auVar124._24_4_ = auVar124._0_4_;
    auVar124._28_4_ = auVar124._0_4_;
    auVar10 = vfmadd132ps_fma(auVar124,auVar148,_DAT_01faff20);
    local_400 = ZEXT1632(auVar10);
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_400 + (uint)(iVar89 << 2));
  } while( true );
LAB_01655823:
  if (bVar92 != false) {
    return bVar92;
  }
  uVar96 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar112._4_4_ = uVar96;
  auVar112._0_4_ = uVar96;
  auVar112._8_4_ = uVar96;
  auVar112._12_4_ = uVar96;
  auVar5 = vcmpps_avx(local_5a0,auVar112,2);
  uVar85 = vmovmskps_avx(auVar5);
  uVar85 = (uint)local_8a8 & uVar85;
  if (uVar85 == 0) {
    return false;
  }
  goto LAB_0165301a;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }